

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  byte bVar56;
  byte bVar57;
  ulong uVar58;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong uVar59;
  byte bVar60;
  ulong uVar61;
  byte bVar62;
  ulong uVar63;
  ulong uVar64;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined8 in_R11;
  byte bVar65;
  int iVar66;
  byte bVar67;
  bool bVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar136;
  uint uVar137;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar138;
  uint uVar142;
  undefined1 auVar133 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar134 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar135 [32];
  float pp;
  float fVar143;
  float fVar144;
  float fVar161;
  float fVar162;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar178 [16];
  undefined1 auVar182 [32];
  float fVar183;
  float fVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar215 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar222 [32];
  undefined1 auVar221 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 in_ZMM4 [64];
  float fVar236;
  float fVar242;
  undefined1 auVar239 [32];
  undefined1 auVar238 [16];
  undefined1 auVar240 [32];
  undefined1 auVar237 [16];
  undefined1 auVar241 [64];
  undefined1 auVar243 [32];
  undefined1 auVar246 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar247 [64];
  float fVar248;
  float fVar255;
  undefined1 auVar251 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar253;
  float fVar254;
  undefined1 auVar252 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  float fVar260;
  undefined1 auVar259 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  undefined1 auVar266 [32];
  float fVar267;
  undefined1 auVar268 [32];
  undefined1 auVar269 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  RTCHitN local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar153 [32];
  
  uVar58 = (ulong)(byte)prim[1];
  fVar248 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar76 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar77 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  fVar209 = fVar248 * auVar77._0_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar58 * 4 + 6);
  auVar87 = vpmovsxbd_avx2(auVar13);
  fVar143 = fVar248 * auVar76._0_4_;
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar58 * 5 + 6);
  auVar85 = vpmovsxbd_avx2(auVar14);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar58 * 6 + 6);
  auVar88 = vpmovsxbd_avx2(auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar89 = vpmovsxbd_avx2(auVar74);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar58 * 0xc + 6);
  auVar90 = vpmovsxbd_avx2(auVar71);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar86 = vpmovsxbd_avx2(auVar1);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar91 = vpmovsxbd_avx2(auVar75);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar58 * 0x13 + 6);
  auVar92 = vpmovsxbd_avx2(auVar72);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar58 * 0x14 + 6);
  auVar94 = vpmovsxbd_avx2(auVar228);
  auVar93 = vcvtdq2ps_avx(auVar94);
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  auVar103._4_4_ = fVar143;
  auVar103._0_4_ = fVar143;
  auVar103._8_4_ = fVar143;
  auVar103._12_4_ = fVar143;
  auVar103._16_4_ = fVar143;
  auVar103._20_4_ = fVar143;
  auVar103._24_4_ = fVar143;
  auVar103._28_4_ = fVar143;
  auVar84 = ZEXT1632(CONCAT412(fVar248 * auVar76._12_4_,
                               CONCAT48(fVar248 * auVar76._8_4_,
                                        CONCAT44(fVar248 * auVar76._4_4_,fVar143))));
  auVar95 = vpermps_avx2(auVar105,auVar84);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar83 = vpermps_avx512vl(auVar82,auVar84);
  fVar143 = auVar83._0_4_;
  auVar241._0_4_ = fVar143 * auVar88._0_4_;
  fVar253 = auVar83._4_4_;
  auVar241._4_4_ = fVar253 * auVar88._4_4_;
  fVar254 = auVar83._8_4_;
  auVar241._8_4_ = fVar254 * auVar88._8_4_;
  fVar255 = auVar83._12_4_;
  auVar241._12_4_ = fVar255 * auVar88._12_4_;
  fVar225 = auVar83._16_4_;
  auVar241._16_4_ = fVar225 * auVar88._16_4_;
  fVar226 = auVar83._20_4_;
  auVar241._20_4_ = fVar226 * auVar88._20_4_;
  fVar227 = auVar83._24_4_;
  auVar241._28_36_ = in_ZMM4._28_36_;
  auVar241._24_4_ = fVar227 * auVar88._24_4_;
  auVar84._4_4_ = auVar86._4_4_ * fVar253;
  auVar84._0_4_ = auVar86._0_4_ * fVar143;
  auVar84._8_4_ = auVar86._8_4_ * fVar254;
  auVar84._12_4_ = auVar86._12_4_ * fVar255;
  auVar84._16_4_ = auVar86._16_4_ * fVar225;
  auVar84._20_4_ = auVar86._20_4_ * fVar226;
  auVar84._24_4_ = auVar86._24_4_ * fVar227;
  auVar84._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = fVar253 * auVar93._4_4_;
  auVar94._0_4_ = fVar143 * auVar93._0_4_;
  auVar94._8_4_ = fVar254 * auVar93._8_4_;
  auVar94._12_4_ = fVar255 * auVar93._12_4_;
  auVar94._16_4_ = fVar225 * auVar93._16_4_;
  auVar94._20_4_ = fVar226 * auVar93._20_4_;
  auVar94._24_4_ = fVar227 * auVar93._24_4_;
  auVar94._28_4_ = auVar83._28_4_;
  auVar13 = vfmadd231ps_fma(auVar241._0_32_,auVar95,auVar85);
  auVar14 = vfmadd231ps_fma(auVar84,auVar95,auVar90);
  auVar73 = vfmadd231ps_fma(auVar94,auVar92,auVar95);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar103,auVar87);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar103,auVar89);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar91,auVar103);
  auVar104._4_4_ = fVar209;
  auVar104._0_4_ = fVar209;
  auVar104._8_4_ = fVar209;
  auVar104._12_4_ = fVar209;
  auVar104._16_4_ = fVar209;
  auVar104._20_4_ = fVar209;
  auVar104._24_4_ = fVar209;
  auVar104._28_4_ = fVar209;
  auVar95 = ZEXT1632(CONCAT412(fVar248 * auVar77._12_4_,
                               CONCAT48(fVar248 * auVar77._8_4_,
                                        CONCAT44(fVar248 * auVar77._4_4_,fVar209))));
  auVar94 = vpermps_avx2(auVar105,auVar95);
  auVar84 = vpermps_avx512vl(auVar82,auVar95);
  fVar248 = auVar84._0_4_;
  fVar143 = auVar84._4_4_;
  auVar95._4_4_ = fVar143 * auVar88._4_4_;
  auVar95._0_4_ = fVar248 * auVar88._0_4_;
  fVar253 = auVar84._8_4_;
  auVar95._8_4_ = fVar253 * auVar88._8_4_;
  fVar254 = auVar84._12_4_;
  auVar95._12_4_ = fVar254 * auVar88._12_4_;
  fVar255 = auVar84._16_4_;
  auVar95._16_4_ = fVar255 * auVar88._16_4_;
  fVar225 = auVar84._20_4_;
  auVar95._20_4_ = fVar225 * auVar88._20_4_;
  fVar226 = auVar84._24_4_;
  auVar95._24_4_ = fVar226 * auVar88._24_4_;
  auVar95._28_4_ = auVar88._28_4_;
  auVar99._0_4_ = fVar248 * auVar86._0_4_;
  auVar99._4_4_ = fVar143 * auVar86._4_4_;
  auVar99._8_4_ = fVar253 * auVar86._8_4_;
  auVar99._12_4_ = fVar254 * auVar86._12_4_;
  auVar99._16_4_ = fVar255 * auVar86._16_4_;
  auVar99._20_4_ = fVar225 * auVar86._20_4_;
  auVar99._24_4_ = fVar226 * auVar86._24_4_;
  auVar99._28_4_ = 0;
  auVar86._4_4_ = fVar143 * auVar93._4_4_;
  auVar86._0_4_ = fVar248 * auVar93._0_4_;
  auVar86._8_4_ = fVar253 * auVar93._8_4_;
  auVar86._12_4_ = fVar254 * auVar93._12_4_;
  auVar86._16_4_ = fVar255 * auVar93._16_4_;
  auVar86._20_4_ = fVar225 * auVar93._20_4_;
  auVar86._24_4_ = fVar226 * auVar93._24_4_;
  auVar86._28_4_ = auVar93._28_4_;
  auVar74 = vfmadd231ps_fma(auVar95,auVar94,auVar85);
  auVar71 = vfmadd231ps_fma(auVar99,auVar94,auVar90);
  auVar1 = vfmadd231ps_fma(auVar86,auVar94,auVar92);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar104,auVar87);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar104,auVar89);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar104,auVar91);
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  auVar102._8_4_ = 0x219392ef;
  auVar102._0_8_ = 0x219392ef219392ef;
  auVar102._12_4_ = 0x219392ef;
  auVar102._16_4_ = 0x219392ef;
  auVar102._20_4_ = 0x219392ef;
  auVar102._24_4_ = 0x219392ef;
  auVar102._28_4_ = 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar13),auVar100);
  uVar64 = vcmpps_avx512vl(auVar87,auVar102,1);
  bVar68 = (bool)((byte)uVar64 & 1);
  auVar82._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._0_4_;
  bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._4_4_;
  bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._8_4_;
  bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar64 >> 7) * 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar14),auVar100);
  uVar64 = vcmpps_avx512vl(auVar87,auVar102,1);
  bVar68 = (bool)((byte)uVar64 & 1);
  auVar83._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._0_4_;
  bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._4_4_;
  bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._8_4_;
  bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar64 >> 7) * 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar73),auVar100);
  uVar64 = vcmpps_avx512vl(auVar87,auVar102,1);
  bVar68 = (bool)((byte)uVar64 & 1);
  auVar87._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar73._0_4_;
  bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar73._4_4_;
  bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar73._8_4_;
  bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar73._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar64 >> 7) * 0x219392ef;
  auVar85 = vrcp14ps_avx512vl(auVar82);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar82,auVar85,auVar101);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar14 = vfnmadd213ps_fma(auVar83,auVar85,auVar101);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar87);
  auVar73 = vfnmadd213ps_fma(auVar87,auVar85,auVar101);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar85,auVar85);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 7 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar74));
  auVar91._4_4_ = auVar13._4_4_ * auVar87._4_4_;
  auVar91._0_4_ = auVar13._0_4_ * auVar87._0_4_;
  auVar91._8_4_ = auVar13._8_4_ * auVar87._8_4_;
  auVar91._12_4_ = auVar13._12_4_ * auVar87._12_4_;
  auVar91._16_4_ = auVar87._16_4_ * 0.0;
  auVar91._20_4_ = auVar87._20_4_ * 0.0;
  auVar91._24_4_ = auVar87._24_4_ * 0.0;
  auVar91._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 9 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar74));
  auVar96._0_4_ = auVar13._0_4_ * auVar87._0_4_;
  auVar96._4_4_ = auVar13._4_4_ * auVar87._4_4_;
  auVar96._8_4_ = auVar13._8_4_ * auVar87._8_4_;
  auVar96._12_4_ = auVar13._12_4_ * auVar87._12_4_;
  auVar96._16_4_ = auVar87._16_4_ * 0.0;
  auVar96._20_4_ = auVar87._20_4_ * 0.0;
  auVar96._24_4_ = auVar87._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0xe + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar71));
  auVar92._4_4_ = auVar14._4_4_ * auVar87._4_4_;
  auVar92._0_4_ = auVar14._0_4_ * auVar87._0_4_;
  auVar92._8_4_ = auVar14._8_4_ * auVar87._8_4_;
  auVar92._12_4_ = auVar14._12_4_ * auVar87._12_4_;
  auVar92._16_4_ = auVar87._16_4_ * 0.0;
  auVar92._20_4_ = auVar87._20_4_ * 0.0;
  auVar92._24_4_ = auVar87._24_4_ * 0.0;
  auVar92._28_4_ = auVar87._28_4_;
  auVar86 = vpbroadcastd_avx512vl();
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar71));
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0x15 + 6));
  auVar98._0_4_ = auVar14._0_4_ * auVar87._0_4_;
  auVar98._4_4_ = auVar14._4_4_ * auVar87._4_4_;
  auVar98._8_4_ = auVar14._8_4_ * auVar87._8_4_;
  auVar98._12_4_ = auVar14._12_4_ * auVar87._12_4_;
  auVar98._16_4_ = auVar87._16_4_ * 0.0;
  auVar98._20_4_ = auVar87._20_4_ * 0.0;
  auVar98._24_4_ = auVar87._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar87 = vcvtdq2ps_avx(auVar85);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar1));
  auVar93._4_4_ = auVar87._4_4_ * auVar73._4_4_;
  auVar93._0_4_ = auVar87._0_4_ * auVar73._0_4_;
  auVar93._8_4_ = auVar87._8_4_ * auVar73._8_4_;
  auVar93._12_4_ = auVar87._12_4_ * auVar73._12_4_;
  auVar93._16_4_ = auVar87._16_4_ * 0.0;
  auVar93._20_4_ = auVar87._20_4_ * 0.0;
  auVar93._24_4_ = auVar87._24_4_ * 0.0;
  auVar93._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0x17 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar1));
  auVar97._0_4_ = auVar73._0_4_ * auVar87._0_4_;
  auVar97._4_4_ = auVar73._4_4_ * auVar87._4_4_;
  auVar97._8_4_ = auVar73._8_4_ * auVar87._8_4_;
  auVar97._12_4_ = auVar73._12_4_ * auVar87._12_4_;
  auVar97._16_4_ = auVar87._16_4_ * 0.0;
  auVar97._20_4_ = auVar87._20_4_ * 0.0;
  auVar97._24_4_ = auVar87._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar87 = vpminsd_avx2(auVar91,auVar96);
  auVar85 = vpminsd_avx2(auVar92,auVar98);
  auVar87 = vmaxps_avx(auVar87,auVar85);
  auVar85 = vpminsd_avx2(auVar93,auVar97);
  uVar167 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar88._4_4_ = uVar167;
  auVar88._0_4_ = uVar167;
  auVar88._8_4_ = uVar167;
  auVar88._12_4_ = uVar167;
  auVar88._16_4_ = uVar167;
  auVar88._20_4_ = uVar167;
  auVar88._24_4_ = uVar167;
  auVar88._28_4_ = uVar167;
  auVar85 = vmaxps_avx512vl(auVar85,auVar88);
  auVar87 = vmaxps_avx(auVar87,auVar85);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  auVar85._16_4_ = 0x3f7ffffa;
  auVar85._20_4_ = 0x3f7ffffa;
  auVar85._24_4_ = 0x3f7ffffa;
  auVar85._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar87,auVar85);
  auVar87 = vpmaxsd_avx2(auVar91,auVar96);
  auVar85 = vpmaxsd_avx2(auVar92,auVar98);
  auVar87 = vminps_avx(auVar87,auVar85);
  auVar85 = vpmaxsd_avx2(auVar93,auVar97);
  uVar167 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar89._4_4_ = uVar167;
  auVar89._0_4_ = uVar167;
  auVar89._8_4_ = uVar167;
  auVar89._12_4_ = uVar167;
  auVar89._16_4_ = uVar167;
  auVar89._20_4_ = uVar167;
  auVar89._24_4_ = uVar167;
  auVar89._28_4_ = uVar167;
  auVar85 = vminps_avx512vl(auVar85,auVar89);
  auVar87 = vminps_avx(auVar87,auVar85);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar90);
  uVar16 = vcmpps_avx512vl(local_300,auVar87,2);
  uVar18 = vpcmpgtd_avx512vl(auVar86,_DAT_01fb4ba0);
  uVar64 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar18));
  local_500 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_019dbca9:
  iVar66 = 1;
  if (uVar64 == 0) {
LAB_019de6e7:
    return uVar64 != 0;
  }
  iVar19 = 0;
  for (uVar59 = uVar64; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    iVar19 = iVar19 + 1;
  }
  uVar63 = uVar64 - 1 & uVar64;
  uVar59 = (ulong)(uint)(iVar19 << 6);
  auVar13 = *(undefined1 (*) [16])(prim + uVar59 + uVar58 * 0x19 + 0x16);
  if (uVar63 != 0) {
    uVar61 = uVar63 - 1 & uVar63;
    for (uVar69 = uVar63; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    }
    if (uVar61 != 0) {
      for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar14 = *(undefined1 (*) [16])(prim + uVar59 + uVar58 * 0x19 + 0x26);
  auVar73 = *(undefined1 (*) [16])(prim + uVar59 + uVar58 * 0x19 + 0x36);
  auVar74 = *(undefined1 (*) [16])(prim + uVar59 + uVar58 * 0x19 + 0x46);
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar167 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar79._4_4_ = uVar167;
  auVar79._0_4_ = uVar167;
  auVar79._8_4_ = uVar167;
  auVar79._12_4_ = uVar167;
  local_5a0._16_4_ = uVar167;
  local_5a0._0_16_ = auVar79;
  local_5a0._20_4_ = uVar167;
  local_5a0._24_4_ = uVar167;
  local_5a0._28_4_ = uVar167;
  auVar265 = ZEXT3264(local_5a0);
  uVar167 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar81._4_4_ = uVar167;
  auVar81._0_4_ = uVar167;
  auVar81._8_4_ = uVar167;
  auVar81._12_4_ = uVar167;
  local_5c0._16_4_ = uVar167;
  local_5c0._0_16_ = auVar81;
  local_5c0._20_4_ = uVar167;
  local_5c0._24_4_ = uVar167;
  local_5c0._28_4_ = uVar167;
  auVar71 = vunpcklps_avx(auVar79,auVar81);
  fVar248 = *(float *)(ray + k * 4 + 0xc0);
  auVar256._4_4_ = fVar248;
  auVar256._0_4_ = fVar248;
  auVar256._8_4_ = fVar248;
  auVar256._12_4_ = fVar248;
  local_5e0._16_4_ = fVar248;
  local_5e0._0_16_ = auVar256;
  local_5e0._20_4_ = fVar248;
  local_5e0._24_4_ = fVar248;
  local_5e0._28_4_ = fVar248;
  local_7b0 = vinsertps_avx(auVar71,auVar256,0x28);
  auVar257 = ZEXT1664(local_7b0);
  auVar77._0_4_ = auVar13._0_4_ + auVar14._0_4_ + auVar73._0_4_ + auVar74._0_4_;
  auVar77._4_4_ = auVar13._4_4_ + auVar14._4_4_ + auVar73._4_4_ + auVar74._4_4_;
  auVar77._8_4_ = auVar13._8_4_ + auVar14._8_4_ + auVar73._8_4_ + auVar74._8_4_;
  auVar77._12_4_ = auVar13._12_4_ + auVar14._12_4_ + auVar73._12_4_ + auVar74._12_4_;
  auVar76._8_4_ = 0x3e800000;
  auVar76._0_8_ = 0x3e8000003e800000;
  auVar76._12_4_ = 0x3e800000;
  auVar71 = vmulps_avx512vl(auVar77,auVar76);
  auVar71 = vsubps_avx(auVar71,auVar1);
  auVar71 = vdpps_avx(auVar71,local_7b0,0x7f);
  fVar143 = *(float *)(ray + k * 4 + 0x60);
  auVar259 = ZEXT464((uint)fVar143);
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  auVar261 = ZEXT1664(local_7c0);
  uVar2 = *(uint *)(prim + 2);
  auVar78._4_12_ = ZEXT812(0) << 0x20;
  auVar78._0_4_ = local_7c0._0_4_;
  auVar72 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar78);
  auVar75 = vfnmadd213ss_fma(auVar72,local_7c0,ZEXT416(0x40000000));
  local_2e0 = auVar71._0_4_ * auVar72._0_4_ * auVar75._0_4_;
  auVar80._4_4_ = local_2e0;
  auVar80._0_4_ = local_2e0;
  auVar80._8_4_ = local_2e0;
  auVar80._12_4_ = local_2e0;
  fStack_570 = local_2e0;
  _local_580 = auVar80;
  fStack_56c = local_2e0;
  fStack_568 = local_2e0;
  fStack_564 = local_2e0;
  auVar71 = vfmadd231ps_fma(auVar1,local_7b0,auVar80);
  auVar71 = vblendps_avx(auVar71,ZEXT816(0) << 0x40,8);
  auVar13 = vsubps_avx(auVar13,auVar71);
  auVar73 = vsubps_avx(auVar73,auVar71);
  auVar247 = ZEXT1664(auVar73);
  auVar14 = vsubps_avx(auVar14,auVar71);
  auVar252 = ZEXT1664(auVar14);
  auVar74 = vsubps_avx(auVar74,auVar71);
  auVar87 = vbroadcastss_avx512vl(auVar13);
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  local_740 = ZEXT1632(auVar13);
  auVar85 = vpermps_avx512vl(auVar107,local_740);
  auVar108._8_4_ = 2;
  auVar108._0_8_ = 0x200000002;
  auVar108._12_4_ = 2;
  auVar108._16_4_ = 2;
  auVar108._20_4_ = 2;
  auVar108._24_4_ = 2;
  auVar108._28_4_ = 2;
  auVar88 = vpermps_avx512vl(auVar108,local_740);
  auVar109._8_4_ = 3;
  auVar109._0_8_ = 0x300000003;
  auVar109._12_4_ = 3;
  auVar109._16_4_ = 3;
  auVar109._20_4_ = 3;
  auVar109._24_4_ = 3;
  auVar109._28_4_ = 3;
  auVar89 = vpermps_avx512vl(auVar109,local_740);
  auVar90 = vbroadcastss_avx512vl(auVar14);
  local_780 = ZEXT1632(auVar14);
  auVar86 = vpermps_avx512vl(auVar107,local_780);
  auVar91 = vpermps_avx512vl(auVar108,local_780);
  auVar92 = vpermps_avx512vl(auVar109,local_780);
  auVar93 = vbroadcastss_avx512vl(auVar73);
  local_760 = ZEXT1632(auVar73);
  auVar94 = vpermps_avx512vl(auVar107,local_760);
  auVar95 = vpermps_avx512vl(auVar108,local_760);
  auVar84 = vpermps_avx512vl(auVar109,local_760);
  local_260 = vbroadcastss_avx512vl(auVar74);
  _local_7a0 = ZEXT1632(auVar74);
  local_280 = vpermps_avx2(auVar107,_local_7a0);
  local_240 = vpermps_avx512vl(auVar108,_local_7a0);
  local_2c0 = vpermps_avx2(auVar109,_local_7a0);
  auVar13 = vfmadd231ps_fma(ZEXT432((uint)(fVar248 * fVar248)),local_5c0,local_5c0);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_5a0,local_5a0);
  local_220._0_4_ = auVar13._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar106);
  local_6e0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar143 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4a0 = vpbroadcastd_avx512vl();
  uVar59 = 0;
  bVar67 = 0;
  local_4c0 = vpbroadcastd_avx512vl();
  auVar13 = vsqrtss_avx(local_7c0,local_7c0);
  auVar14 = vsqrtss_avx(local_7c0,local_7c0);
  local_510 = ZEXT816(0x3f80000000000000);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar269 = ZEXT3264(auVar82);
  auVar241 = ZEXT3264(_DAT_01f7b040);
  local_2a0 = local_240;
  do {
    auVar73 = vmovshdup_avx(local_510);
    auVar73 = vsubps_avx(auVar73,local_510);
    auVar145._0_4_ = auVar73._0_4_;
    fVar15 = auVar145._0_4_ * 0.04761905;
    uVar167 = local_510._0_4_;
    auVar231._4_4_ = uVar167;
    auVar231._0_4_ = uVar167;
    auVar231._8_4_ = uVar167;
    auVar231._12_4_ = uVar167;
    auVar231._16_4_ = uVar167;
    auVar231._20_4_ = uVar167;
    auVar231._24_4_ = uVar167;
    auVar231._28_4_ = uVar167;
    auVar145._4_4_ = auVar145._0_4_;
    auVar145._8_4_ = auVar145._0_4_;
    auVar145._12_4_ = auVar145._0_4_;
    auVar153._16_4_ = auVar145._0_4_;
    auVar153._0_16_ = auVar145;
    auVar153._20_4_ = auVar145._0_4_;
    auVar153._24_4_ = auVar145._0_4_;
    auVar153._28_4_ = auVar145._0_4_;
    auVar73 = vfmadd231ps_fma(auVar231,auVar153,auVar241._0_32_);
    auVar268 = auVar269._0_32_;
    auVar83 = vsubps_avx512vl(auVar268,ZEXT1632(auVar73));
    fVar248 = auVar83._0_4_;
    fVar254 = auVar83._4_4_;
    fVar225 = auVar83._8_4_;
    fVar227 = auVar83._12_4_;
    fVar236 = auVar83._16_4_;
    fVar267 = auVar83._20_4_;
    fVar184 = auVar83._24_4_;
    fVar144 = fVar248 * fVar248 * fVar248;
    fVar161 = fVar254 * fVar254 * fVar254;
    auVar114._4_4_ = fVar161;
    auVar114._0_4_ = fVar144;
    fVar162 = fVar225 * fVar225 * fVar225;
    auVar114._8_4_ = fVar162;
    fVar163 = fVar227 * fVar227 * fVar227;
    auVar114._12_4_ = fVar163;
    fVar164 = fVar236 * fVar236 * fVar236;
    auVar114._16_4_ = fVar164;
    fVar165 = fVar267 * fVar267 * fVar267;
    auVar114._20_4_ = fVar165;
    fVar166 = fVar184 * fVar184 * fVar184;
    auVar114._24_4_ = fVar166;
    auVar114._28_4_ = auVar145._0_4_;
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar82 = vmulps_avx512vl(auVar114,auVar96);
    fVar253 = auVar73._0_4_;
    fVar255 = auVar73._4_4_;
    fVar226 = auVar73._8_4_;
    fVar209 = auVar73._12_4_;
    fVar183 = fVar253 * fVar253 * fVar253;
    fVar206 = fVar255 * fVar255 * fVar255;
    fVar207 = fVar226 * fVar226 * fVar226;
    fVar208 = fVar209 * fVar209 * fVar209;
    auVar258._0_4_ = fVar253 * fVar248;
    auVar258._4_4_ = fVar255 * fVar254;
    auVar258._8_4_ = fVar226 * fVar225;
    auVar258._12_4_ = fVar209 * fVar227;
    auVar258._16_4_ = fVar236 * 0.0;
    auVar258._20_4_ = fVar267 * 0.0;
    auVar258._28_36_ = auVar257._28_36_;
    auVar258._24_4_ = fVar184 * 0.0;
    auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar208,CONCAT48(fVar207,CONCAT44(fVar206,fVar183))
                                                )),auVar96);
    fVar260 = auVar97._28_4_ + auVar145._0_4_;
    fVar242 = fVar260 + auVar261._28_4_ + auVar241._28_4_;
    auVar115._4_4_ = fVar161 * 0.16666667;
    auVar115._0_4_ = fVar144 * 0.16666667;
    auVar115._8_4_ = fVar162 * 0.16666667;
    auVar115._12_4_ = fVar163 * 0.16666667;
    auVar115._16_4_ = fVar164 * 0.16666667;
    auVar115._20_4_ = fVar165 * 0.16666667;
    auVar115._24_4_ = fVar166 * 0.16666667;
    auVar115._28_4_ = fVar260;
    auVar116._4_4_ =
         (auVar258._4_4_ * fVar254 * 12.0 + auVar258._4_4_ * fVar255 * 6.0 + fVar206 + auVar82._4_4_
         ) * 0.16666667;
    auVar116._0_4_ =
         (auVar258._0_4_ * fVar248 * 12.0 + auVar258._0_4_ * fVar253 * 6.0 + fVar183 + auVar82._0_4_
         ) * 0.16666667;
    auVar116._8_4_ =
         (auVar258._8_4_ * fVar225 * 12.0 + auVar258._8_4_ * fVar226 * 6.0 + fVar207 + auVar82._8_4_
         ) * 0.16666667;
    auVar116._12_4_ =
         (auVar258._12_4_ * fVar227 * 12.0 + auVar258._12_4_ * fVar209 * 6.0 +
         fVar208 + auVar82._12_4_) * 0.16666667;
    auVar116._16_4_ =
         (auVar258._16_4_ * fVar236 * 12.0 + auVar258._16_4_ * 0.0 * 6.0 + auVar82._16_4_ + 0.0) *
         0.16666667;
    auVar116._20_4_ =
         (auVar258._20_4_ * fVar267 * 12.0 + auVar258._20_4_ * 0.0 * 6.0 + auVar82._20_4_ + 0.0) *
         0.16666667;
    auVar116._24_4_ =
         (auVar258._24_4_ * fVar184 * 12.0 + auVar258._24_4_ * 0.0 * 6.0 + auVar82._24_4_ + 0.0) *
         0.16666667;
    auVar116._28_4_ = auVar261._28_4_;
    auVar117._4_4_ =
         (auVar97._4_4_ + fVar161 + auVar258._4_4_ * fVar255 * 12.0 + auVar258._4_4_ * fVar254 * 6.0
         ) * 0.16666667;
    auVar117._0_4_ =
         (auVar97._0_4_ + fVar144 + auVar258._0_4_ * fVar253 * 12.0 + auVar258._0_4_ * fVar248 * 6.0
         ) * 0.16666667;
    auVar117._8_4_ =
         (auVar97._8_4_ + fVar162 + auVar258._8_4_ * fVar226 * 12.0 + auVar258._8_4_ * fVar225 * 6.0
         ) * 0.16666667;
    auVar117._12_4_ =
         (auVar97._12_4_ + fVar163 +
         auVar258._12_4_ * fVar209 * 12.0 + auVar258._12_4_ * fVar227 * 6.0) * 0.16666667;
    auVar117._16_4_ =
         (auVar97._16_4_ + fVar164 + auVar258._16_4_ * 0.0 * 12.0 + auVar258._16_4_ * fVar236 * 6.0)
         * 0.16666667;
    auVar117._20_4_ =
         (auVar97._20_4_ + fVar165 + auVar258._20_4_ * 0.0 * 12.0 + auVar258._20_4_ * fVar267 * 6.0)
         * 0.16666667;
    auVar117._24_4_ =
         (auVar97._24_4_ + fVar166 + auVar258._24_4_ * 0.0 * 12.0 + auVar258._24_4_ * fVar184 * 6.0)
         * 0.16666667;
    auVar117._28_4_ = auVar265._28_4_;
    fVar183 = fVar183 * 0.16666667;
    fVar206 = fVar206 * 0.16666667;
    fVar207 = fVar207 * 0.16666667;
    fVar208 = fVar208 * 0.16666667;
    auVar118._28_4_ = fVar242;
    auVar118._0_28_ = ZEXT1628(CONCAT412(fVar208,CONCAT48(fVar207,CONCAT44(fVar206,fVar183))));
    auVar97 = vmulps_avx512vl(local_260,auVar118);
    auVar119._4_4_ = local_280._4_4_ * fVar206;
    auVar119._0_4_ = local_280._0_4_ * fVar183;
    auVar119._8_4_ = local_280._8_4_ * fVar207;
    auVar119._12_4_ = local_280._12_4_ * fVar208;
    auVar119._16_4_ = local_280._16_4_ * 0.0;
    auVar119._20_4_ = local_280._20_4_ * 0.0;
    auVar119._24_4_ = local_280._24_4_ * 0.0;
    auVar119._28_4_ = auVar259._28_4_ + auVar265._28_4_ + auVar82._28_4_ + 0.0;
    auVar82 = vmulps_avx512vl(local_2a0,auVar118);
    auVar120._4_4_ = local_2c0._4_4_ * fVar206;
    auVar120._0_4_ = local_2c0._0_4_ * fVar183;
    auVar120._8_4_ = local_2c0._8_4_ * fVar207;
    auVar120._12_4_ = local_2c0._12_4_ * fVar208;
    auVar120._16_4_ = local_2c0._16_4_ * 0.0;
    auVar120._20_4_ = local_2c0._20_4_ * 0.0;
    auVar120._24_4_ = local_2c0._24_4_ * 0.0;
    auVar120._28_4_ = fVar242;
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar117,auVar93);
    auVar98 = vfmadd231ps_avx512vl(auVar119,auVar117,auVar94);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar117,auVar95);
    auVar99 = vfmadd231ps_avx512vl(auVar120,auVar84,auVar117);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar116,auVar90);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar116,auVar86);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar116,auVar91);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar92,auVar116);
    auVar100 = vfmadd231ps_avx512vl(auVar97,auVar115,auVar87);
    auVar101 = vfmadd231ps_avx512vl(auVar98,auVar115,auVar85);
    auVar102 = vfmadd231ps_avx512vl(auVar82,auVar115,auVar88);
    auVar97 = vfmadd231ps_avx512vl(auVar99,auVar89,auVar115);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar99 = vxorps_avx512vl(auVar83,auVar98);
    auVar103 = vxorps_avx512vl(ZEXT1632(auVar73),auVar98);
    auVar232._0_4_ = auVar103._0_4_ * fVar253;
    auVar232._4_4_ = auVar103._4_4_ * fVar255;
    auVar232._8_4_ = auVar103._8_4_ * fVar226;
    auVar232._12_4_ = auVar103._12_4_ * fVar209;
    auVar232._16_4_ = auVar103._16_4_ * 0.0;
    auVar232._20_4_ = auVar103._20_4_ * 0.0;
    auVar232._24_4_ = auVar103._24_4_ * 0.0;
    auVar232._28_4_ = 0;
    auVar104 = vmulps_avx512vl(auVar258._0_32_,auVar96);
    auVar82 = vsubps_avx(auVar232,auVar104);
    auVar121._4_4_ = auVar99._4_4_ * fVar254 * 0.5;
    auVar121._0_4_ = auVar99._0_4_ * fVar248 * 0.5;
    auVar121._8_4_ = auVar99._8_4_ * fVar225 * 0.5;
    auVar121._12_4_ = auVar99._12_4_ * fVar227 * 0.5;
    auVar121._16_4_ = auVar99._16_4_ * fVar236 * 0.5;
    auVar121._20_4_ = auVar99._20_4_ * fVar267 * 0.5;
    auVar121._24_4_ = auVar99._24_4_ * fVar184 * 0.5;
    auVar121._28_4_ = auVar83._28_4_;
    auVar122._4_4_ = auVar82._4_4_ * 0.5;
    auVar122._0_4_ = auVar82._0_4_ * 0.5;
    auVar122._8_4_ = auVar82._8_4_ * 0.5;
    auVar122._12_4_ = auVar82._12_4_ * 0.5;
    auVar122._16_4_ = auVar82._16_4_ * 0.5;
    auVar122._20_4_ = auVar82._20_4_ * 0.5;
    auVar122._24_4_ = auVar82._24_4_ * 0.5;
    auVar122._28_4_ = auVar82._28_4_;
    auVar125._4_4_ = (auVar104._4_4_ + fVar254 * fVar254) * 0.5;
    auVar125._0_4_ = (auVar104._0_4_ + fVar248 * fVar248) * 0.5;
    auVar125._8_4_ = (auVar104._8_4_ + fVar225 * fVar225) * 0.5;
    auVar125._12_4_ = (auVar104._12_4_ + fVar227 * fVar227) * 0.5;
    auVar125._16_4_ = (auVar104._16_4_ + fVar236 * fVar236) * 0.5;
    auVar125._20_4_ = (auVar104._20_4_ + fVar267 * fVar267) * 0.5;
    auVar125._24_4_ = (auVar104._24_4_ + fVar184 * fVar184) * 0.5;
    auVar125._28_4_ = auVar104._28_4_ + auVar247._28_4_;
    fVar248 = fVar253 * fVar253 * 0.5;
    fVar253 = fVar255 * fVar255 * 0.5;
    fVar254 = fVar226 * fVar226 * 0.5;
    fVar255 = fVar209 * fVar209 * 0.5;
    auVar126._28_4_ = auVar252._28_4_;
    auVar126._0_28_ = ZEXT1628(CONCAT412(fVar255,CONCAT48(fVar254,CONCAT44(fVar253,fVar248))));
    auVar82 = vmulps_avx512vl(local_260,auVar126);
    auVar32._4_4_ = local_280._4_4_ * fVar253;
    auVar32._0_4_ = local_280._0_4_ * fVar248;
    auVar32._8_4_ = local_280._8_4_ * fVar254;
    auVar32._12_4_ = local_280._12_4_ * fVar255;
    auVar32._16_4_ = local_280._16_4_ * 0.0;
    auVar32._20_4_ = local_280._20_4_ * 0.0;
    auVar32._24_4_ = local_280._24_4_ * 0.0;
    auVar32._28_4_ = auVar103._28_4_;
    auVar83 = vmulps_avx512vl(local_2a0,auVar126);
    auVar33._4_4_ = fVar253 * local_2c0._4_4_;
    auVar33._0_4_ = fVar248 * local_2c0._0_4_;
    auVar33._8_4_ = fVar254 * local_2c0._8_4_;
    auVar33._12_4_ = fVar255 * local_2c0._12_4_;
    auVar33._16_4_ = local_2c0._16_4_ * 0.0;
    auVar33._20_4_ = local_2c0._20_4_ * 0.0;
    auVar33._24_4_ = local_2c0._24_4_ * 0.0;
    auVar33._28_4_ = auVar252._28_4_;
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar125,auVar93);
    auVar99 = vfmadd231ps_avx512vl(auVar32,auVar125,auVar94);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar125,auVar95);
    auVar73 = vfmadd231ps_fma(auVar33,auVar84,auVar125);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar122,auVar90);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar122,auVar86);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar122,auVar91);
    auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar92,auVar122);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar121,auVar87);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar121,auVar85);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar121,auVar88);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar89,auVar121);
    auVar34._4_4_ = auVar82._4_4_ * fVar15;
    auVar34._0_4_ = auVar82._0_4_ * fVar15;
    auVar34._8_4_ = auVar82._8_4_ * fVar15;
    auVar34._12_4_ = auVar82._12_4_ * fVar15;
    auVar34._16_4_ = auVar82._16_4_ * fVar15;
    auVar34._20_4_ = auVar82._20_4_ * fVar15;
    auVar34._24_4_ = auVar82._24_4_ * fVar15;
    auVar34._28_4_ = auVar84._28_4_;
    auVar265 = ZEXT3264(auVar34);
    auVar35._4_4_ = auVar99._4_4_ * fVar15;
    auVar35._0_4_ = auVar99._0_4_ * fVar15;
    auVar35._8_4_ = auVar99._8_4_ * fVar15;
    auVar35._12_4_ = auVar99._12_4_ * fVar15;
    auVar35._16_4_ = auVar99._16_4_ * fVar15;
    auVar35._20_4_ = auVar99._20_4_ * fVar15;
    auVar35._24_4_ = auVar99._24_4_ * fVar15;
    auVar35._28_4_ = 0x3e2aaaab;
    auVar36._4_4_ = auVar83._4_4_ * fVar15;
    auVar36._0_4_ = auVar83._0_4_ * fVar15;
    auVar36._8_4_ = auVar83._8_4_ * fVar15;
    auVar36._12_4_ = auVar83._12_4_ * fVar15;
    auVar36._16_4_ = auVar83._16_4_ * fVar15;
    auVar36._20_4_ = auVar83._20_4_ * fVar15;
    auVar36._24_4_ = auVar83._24_4_ * fVar15;
    auVar36._28_4_ = 0x40c00000;
    fVar248 = auVar103._0_4_ * fVar15;
    fVar253 = auVar103._4_4_ * fVar15;
    auVar37._4_4_ = fVar253;
    auVar37._0_4_ = fVar248;
    fVar254 = auVar103._8_4_ * fVar15;
    auVar37._8_4_ = fVar254;
    fVar255 = auVar103._12_4_ * fVar15;
    auVar37._12_4_ = fVar255;
    fVar225 = auVar103._16_4_ * fVar15;
    auVar37._16_4_ = fVar225;
    fVar226 = auVar103._20_4_ * fVar15;
    auVar37._20_4_ = fVar226;
    fVar227 = auVar103._24_4_ * fVar15;
    auVar37._24_4_ = fVar227;
    auVar37._28_4_ = fVar15;
    auVar73 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar257 = ZEXT3264(auVar103);
    auVar104 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar259 = ZEXT3264(auVar104);
    auVar98 = ZEXT1632(auVar73);
    auVar105 = vpermt2ps_avx512vl(auVar102,_DAT_01fb9fc0,auVar98);
    auVar261 = ZEXT3264(auVar105);
    auVar233._0_4_ = fVar248 + auVar97._0_4_;
    auVar233._4_4_ = fVar253 + auVar97._4_4_;
    auVar233._8_4_ = fVar254 + auVar97._8_4_;
    auVar233._12_4_ = fVar255 + auVar97._12_4_;
    auVar233._16_4_ = fVar225 + auVar97._16_4_;
    auVar233._20_4_ = fVar226 + auVar97._20_4_;
    auVar233._24_4_ = fVar227 + auVar97._24_4_;
    auVar233._28_4_ = fVar15 + auVar97._28_4_;
    auVar82 = vmaxps_avx(auVar97,auVar233);
    auVar83 = vminps_avx(auVar97,auVar233);
    auVar106 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar98);
    auVar107 = vpermt2ps_avx512vl(auVar34,_DAT_01fb9fc0,auVar98);
    auVar108 = vpermt2ps_avx512vl(auVar35,_DAT_01fb9fc0,auVar98);
    auVar120 = ZEXT1632(auVar73);
    auVar109 = vpermt2ps_avx512vl(auVar36,_DAT_01fb9fc0,auVar120);
    auVar97 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar120);
    auVar110 = vsubps_avx512vl(auVar106,auVar97);
    auVar97 = vsubps_avx(auVar103,auVar100);
    auVar252 = ZEXT3264(auVar97);
    auVar98 = vsubps_avx(auVar104,auVar101);
    auVar247 = ZEXT3264(auVar98);
    auVar99 = vsubps_avx(auVar105,auVar102);
    auVar111 = vmulps_avx512vl(auVar98,auVar36);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar35,auVar99);
    auVar112 = vmulps_avx512vl(auVar99,auVar34);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar36,auVar97);
    auVar113 = vmulps_avx512vl(auVar97,auVar35);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar34,auVar98);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar112 = vmulps_avx512vl(auVar99,auVar99);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar98,auVar98);
    auVar113 = vfmadd231ps_avx512vl(auVar112,auVar97,auVar97);
    auVar112 = vrcp14ps_avx512vl(auVar113);
    auVar114 = vfnmadd213ps_avx512vl(auVar112,auVar113,auVar268);
    auVar112 = vfmadd132ps_avx512vl(auVar114,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar111,auVar112);
    auVar114 = vmulps_avx512vl(auVar98,auVar109);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar108,auVar99);
    auVar115 = vmulps_avx512vl(auVar99,auVar107);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar109,auVar97);
    auVar116 = vmulps_avx512vl(auVar97,auVar108);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar107,auVar98);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar114,auVar112);
    auVar111 = vmaxps_avx512vl(auVar111,auVar112);
    auVar111 = vsqrtps_avx512vl(auVar111);
    auVar112 = vmaxps_avx512vl(auVar110,auVar106);
    auVar82 = vmaxps_avx512vl(auVar82,auVar112);
    auVar114 = vaddps_avx512vl(auVar111,auVar82);
    auVar82 = vminps_avx512vl(auVar110,auVar106);
    auVar82 = vminps_avx(auVar83,auVar82);
    auVar82 = vsubps_avx512vl(auVar82,auVar111);
    auVar110._8_4_ = 0x3f800002;
    auVar110._0_8_ = 0x3f8000023f800002;
    auVar110._12_4_ = 0x3f800002;
    auVar110._16_4_ = 0x3f800002;
    auVar110._20_4_ = 0x3f800002;
    auVar110._24_4_ = 0x3f800002;
    auVar110._28_4_ = 0x3f800002;
    auVar83 = vmulps_avx512vl(auVar114,auVar110);
    auVar111._8_4_ = 0x3f7ffffc;
    auVar111._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar111._12_4_ = 0x3f7ffffc;
    auVar111._16_4_ = 0x3f7ffffc;
    auVar111._20_4_ = 0x3f7ffffc;
    auVar111._24_4_ = 0x3f7ffffc;
    auVar111._28_4_ = 0x3f7ffffc;
    auVar82 = vmulps_avx512vl(auVar82,auVar111);
    auVar83 = vmulps_avx512vl(auVar83,auVar83);
    auVar106 = vrsqrt14ps_avx512vl(auVar113);
    auVar112._8_4_ = 0xbf000000;
    auVar112._0_8_ = 0xbf000000bf000000;
    auVar112._12_4_ = 0xbf000000;
    auVar112._16_4_ = 0xbf000000;
    auVar112._20_4_ = 0xbf000000;
    auVar112._24_4_ = 0xbf000000;
    auVar112._28_4_ = 0xbf000000;
    auVar110 = vmulps_avx512vl(auVar113,auVar112);
    fVar248 = auVar106._0_4_;
    fVar253 = auVar106._4_4_;
    fVar254 = auVar106._8_4_;
    fVar255 = auVar106._12_4_;
    fVar225 = auVar106._16_4_;
    fVar226 = auVar106._20_4_;
    fVar227 = auVar106._24_4_;
    auVar38._4_4_ = fVar253 * fVar253 * fVar253 * auVar110._4_4_;
    auVar38._0_4_ = fVar248 * fVar248 * fVar248 * auVar110._0_4_;
    auVar38._8_4_ = fVar254 * fVar254 * fVar254 * auVar110._8_4_;
    auVar38._12_4_ = fVar255 * fVar255 * fVar255 * auVar110._12_4_;
    auVar38._16_4_ = fVar225 * fVar225 * fVar225 * auVar110._16_4_;
    auVar38._20_4_ = fVar226 * fVar226 * fVar226 * auVar110._20_4_;
    auVar38._24_4_ = fVar227 * fVar227 * fVar227 * auVar110._24_4_;
    auVar38._28_4_ = auVar114._28_4_;
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar106 = vfmadd231ps_avx512vl(auVar38,auVar106,auVar113);
    auVar110 = vmulps_avx512vl(auVar97,auVar106);
    auVar111 = vmulps_avx512vl(auVar98,auVar106);
    auVar112 = vmulps_avx512vl(auVar99,auVar106);
    auVar113 = vsubps_avx512vl(auVar120,auVar100);
    auVar114 = vsubps_avx512vl(auVar120,auVar101);
    auVar115 = vsubps_avx512vl(auVar120,auVar102);
    auVar116 = vmulps_avx512vl(local_5e0,auVar115);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_5c0,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_5a0,auVar113);
    auVar117 = vmulps_avx512vl(auVar115,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar113);
    auVar118 = vmulps_avx512vl(local_5e0,auVar112);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar111,local_5c0);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar110,local_5a0);
    auVar112 = vmulps_avx512vl(auVar115,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar110);
    auVar111 = vmulps_avx512vl(auVar118,auVar118);
    auVar112 = vsubps_avx512vl(local_220,auVar111);
    auVar119 = vmulps_avx512vl(auVar118,auVar110);
    auVar116 = vsubps_avx512vl(auVar116,auVar119);
    auVar116 = vaddps_avx512vl(auVar116,auVar116);
    auVar119 = vmulps_avx512vl(auVar110,auVar110);
    local_7e0 = vsubps_avx512vl(auVar117,auVar119);
    auVar83 = vsubps_avx512vl(local_7e0,auVar83);
    local_720 = vmulps_avx512vl(auVar116,auVar116);
    auVar96 = vmulps_avx512vl(auVar112,auVar96);
    auVar117 = vmulps_avx512vl(auVar96,auVar83);
    auVar117 = vsubps_avx512vl(local_720,auVar117);
    uVar69 = vcmpps_avx512vl(auVar117,auVar120,5);
    bVar55 = (byte)uVar69;
    if (bVar55 == 0) {
LAB_019dc988:
      auVar241 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      auVar117 = vsqrtps_avx512vl(auVar117);
      auVar119 = vaddps_avx512vl(auVar112,auVar112);
      auVar120 = vrcp14ps_avx512vl(auVar119);
      auVar121 = vfnmadd213ps_avx512vl(auVar120,auVar119,auVar268);
      auVar121 = vfmadd132ps_avx512vl(auVar121,auVar120,auVar120);
      auVar268._8_4_ = 0x80000000;
      auVar268._0_8_ = 0x8000000080000000;
      auVar268._12_4_ = 0x80000000;
      auVar268._16_4_ = 0x80000000;
      auVar268._20_4_ = 0x80000000;
      auVar268._24_4_ = 0x80000000;
      auVar268._28_4_ = 0x80000000;
      _local_620 = vxorps_avx512vl(auVar116,auVar268);
      auVar122 = vsubps_avx512vl(_local_620,auVar117);
      local_600 = vmulps_avx512vl(auVar122,auVar121);
      auVar117 = vsubps_avx512vl(auVar117,auVar116);
      local_640 = vmulps_avx512vl(auVar117,auVar121);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar121 = vblendmps_avx512vl(auVar117,local_600);
      auVar123._0_4_ =
           (uint)(bVar55 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar117._0_4_;
      bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar68 * auVar121._4_4_ | (uint)!bVar68 * auVar117._4_4_;
      bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar68 * auVar121._8_4_ | (uint)!bVar68 * auVar117._8_4_;
      bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar68 * auVar121._12_4_ | (uint)!bVar68 * auVar117._12_4_;
      bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar68 * auVar121._16_4_ | (uint)!bVar68 * auVar117._16_4_;
      bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar68 * auVar121._20_4_ | (uint)!bVar68 * auVar117._20_4_;
      bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar68 * auVar121._24_4_ | (uint)!bVar68 * auVar117._24_4_;
      bVar68 = SUB81(uVar69 >> 7,0);
      auVar123._28_4_ = (uint)bVar68 * auVar121._28_4_ | (uint)!bVar68 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar117,local_640);
      auVar124._0_4_ =
           (uint)(bVar55 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar117._0_4_;
      bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar68 * auVar121._4_4_ | (uint)!bVar68 * auVar117._4_4_;
      bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar68 * auVar121._8_4_ | (uint)!bVar68 * auVar117._8_4_;
      bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar68 * auVar121._12_4_ | (uint)!bVar68 * auVar117._12_4_;
      bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar68 * auVar121._16_4_ | (uint)!bVar68 * auVar117._16_4_;
      bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar68 * auVar121._20_4_ | (uint)!bVar68 * auVar117._20_4_;
      bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar68 * auVar121._24_4_ | (uint)!bVar68 * auVar117._24_4_;
      bVar68 = SUB81(uVar69 >> 7,0);
      auVar124._28_4_ = (uint)bVar68 * auVar121._28_4_ | (uint)!bVar68 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar111,auVar117);
      local_660 = vmaxps_avx512vl(local_240,auVar117);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      local_680 = vmulps_avx512vl(local_660,auVar26);
      vandps_avx512vl(auVar112,auVar117);
      uVar61 = vcmpps_avx512vl(local_680,local_680,1);
      uVar69 = uVar69 & uVar61;
      bVar65 = (byte)uVar69;
      if (bVar65 != 0) {
        uVar61 = vcmpps_avx512vl(auVar83,_DAT_01f7b000,2);
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar112 = vblendmps_avx512vl(auVar83,auVar111);
        bVar60 = (byte)uVar61;
        uVar70 = (uint)(bVar60 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar60 & 1) * local_680._0_4_;
        bVar68 = (bool)((byte)(uVar61 >> 1) & 1);
        uVar136 = (uint)bVar68 * auVar112._4_4_ | (uint)!bVar68 * local_680._4_4_;
        bVar68 = (bool)((byte)(uVar61 >> 2) & 1);
        uVar137 = (uint)bVar68 * auVar112._8_4_ | (uint)!bVar68 * local_680._8_4_;
        bVar68 = (bool)((byte)(uVar61 >> 3) & 1);
        uVar138 = (uint)bVar68 * auVar112._12_4_ | (uint)!bVar68 * local_680._12_4_;
        bVar68 = (bool)((byte)(uVar61 >> 4) & 1);
        uVar139 = (uint)bVar68 * auVar112._16_4_ | (uint)!bVar68 * local_680._16_4_;
        bVar68 = (bool)((byte)(uVar61 >> 5) & 1);
        uVar140 = (uint)bVar68 * auVar112._20_4_ | (uint)!bVar68 * local_680._20_4_;
        bVar68 = (bool)((byte)(uVar61 >> 6) & 1);
        uVar141 = (uint)bVar68 * auVar112._24_4_ | (uint)!bVar68 * local_680._24_4_;
        bVar68 = SUB81(uVar61 >> 7,0);
        uVar142 = (uint)bVar68 * auVar112._28_4_ | (uint)!bVar68 * local_680._28_4_;
        auVar123._0_4_ = (bVar65 & 1) * uVar70 | !(bool)(bVar65 & 1) * auVar123._0_4_;
        bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar123._4_4_ = bVar68 * uVar136 | !bVar68 * auVar123._4_4_;
        bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar123._8_4_ = bVar68 * uVar137 | !bVar68 * auVar123._8_4_;
        bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar123._12_4_ = bVar68 * uVar138 | !bVar68 * auVar123._12_4_;
        bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar123._16_4_ = bVar68 * uVar139 | !bVar68 * auVar123._16_4_;
        bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar123._20_4_ = bVar68 * uVar140 | !bVar68 * auVar123._20_4_;
        bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar123._24_4_ = bVar68 * uVar141 | !bVar68 * auVar123._24_4_;
        bVar68 = SUB81(uVar69 >> 7,0);
        auVar123._28_4_ = bVar68 * uVar142 | !bVar68 * auVar123._28_4_;
        auVar83 = vblendmps_avx512vl(auVar111,auVar83);
        bVar68 = (bool)((byte)(uVar61 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar61 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar61 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar61 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar61 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar61 >> 6) & 1);
        bVar11 = SUB81(uVar61 >> 7,0);
        auVar124._0_4_ =
             (uint)(bVar65 & 1) *
             ((uint)(bVar60 & 1) * auVar83._0_4_ | !(bool)(bVar60 & 1) * uVar70) |
             !(bool)(bVar65 & 1) * auVar124._0_4_;
        bVar5 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar124._4_4_ =
             (uint)bVar5 * ((uint)bVar68 * auVar83._4_4_ | !bVar68 * uVar136) |
             !bVar5 * auVar124._4_4_;
        bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar124._8_4_ =
             (uint)bVar68 * ((uint)bVar6 * auVar83._8_4_ | !bVar6 * uVar137) |
             !bVar68 * auVar124._8_4_;
        bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar124._12_4_ =
             (uint)bVar68 * ((uint)bVar7 * auVar83._12_4_ | !bVar7 * uVar138) |
             !bVar68 * auVar124._12_4_;
        bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar124._16_4_ =
             (uint)bVar68 * ((uint)bVar8 * auVar83._16_4_ | !bVar8 * uVar139) |
             !bVar68 * auVar124._16_4_;
        bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar124._20_4_ =
             (uint)bVar68 * ((uint)bVar9 * auVar83._20_4_ | !bVar9 * uVar140) |
             !bVar68 * auVar124._20_4_;
        bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar124._24_4_ =
             (uint)bVar68 * ((uint)bVar10 * auVar83._24_4_ | !bVar10 * uVar141) |
             !bVar68 * auVar124._24_4_;
        bVar68 = SUB81(uVar69 >> 7,0);
        auVar124._28_4_ =
             (uint)bVar68 * ((uint)bVar11 * auVar83._28_4_ | !bVar11 * uVar142) |
             !bVar68 * auVar124._28_4_;
        bVar55 = (~bVar65 | bVar60) & bVar55;
      }
      if ((bVar55 & 0x7f) == 0) {
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar269 = ZEXT3264(auVar82);
        auVar241 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar109 = vxorps_avx512vl(auVar109,auVar83);
        auVar107 = vxorps_avx512vl(auVar107,auVar83);
        auVar241 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        auVar108 = vxorps_avx512vl(auVar108,auVar83);
        auVar73 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                                 ZEXT416((uint)local_6e0._0_4_));
        auVar111 = vbroadcastss_avx512vl(auVar73);
        auVar111 = vminps_avx512vl(auVar111,auVar124);
        auVar54._4_4_ = fStack_2dc;
        auVar54._0_4_ = local_2e0;
        auVar54._8_4_ = fStack_2d8;
        auVar54._12_4_ = fStack_2d4;
        auVar54._16_4_ = fStack_2d0;
        auVar54._20_4_ = fStack_2cc;
        auVar54._24_4_ = fStack_2c8;
        auVar54._28_4_ = fStack_2c4;
        auVar112 = vmaxps_avx512vl(auVar54,auVar123);
        auVar115 = vmulps_avx512vl(auVar36,auVar115);
        auVar114 = vfmadd213ps_avx512vl(auVar114,auVar35,auVar115);
        auVar73 = vfmadd213ps_fma(auVar113,auVar34,auVar114);
        auVar113 = vmulps_avx512vl(local_5e0,auVar36);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_5c0,auVar35);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_5a0,auVar34);
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar113,auVar114);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar16 = vcmpps_avx512vl(auVar114,auVar115,1);
        auVar117 = vxorps_avx512vl(ZEXT1632(auVar73),auVar83);
        auVar121 = vrcp14ps_avx512vl(auVar113);
        auVar122 = vxorps_avx512vl(auVar113,auVar83);
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar126 = vfnmadd213ps_avx512vl(auVar121,auVar113,auVar125);
        auVar73 = vfmadd132ps_fma(auVar126,auVar121,auVar121);
        fVar248 = auVar73._0_4_ * auVar117._0_4_;
        fVar253 = auVar73._4_4_ * auVar117._4_4_;
        auVar39._4_4_ = fVar253;
        auVar39._0_4_ = fVar248;
        fVar254 = auVar73._8_4_ * auVar117._8_4_;
        auVar39._8_4_ = fVar254;
        fVar255 = auVar73._12_4_ * auVar117._12_4_;
        auVar39._12_4_ = fVar255;
        fVar225 = auVar117._16_4_ * 0.0;
        auVar39._16_4_ = fVar225;
        fVar226 = auVar117._20_4_ * 0.0;
        auVar39._20_4_ = fVar226;
        fVar227 = auVar117._24_4_ * 0.0;
        auVar39._24_4_ = fVar227;
        auVar39._28_4_ = auVar117._28_4_;
        uVar18 = vcmpps_avx512vl(auVar113,auVar122,1);
        bVar65 = (byte)uVar16 | (byte)uVar18;
        auVar266._8_4_ = 0xff800000;
        auVar266._0_8_ = 0xff800000ff800000;
        auVar266._12_4_ = 0xff800000;
        auVar266._16_4_ = 0xff800000;
        auVar266._20_4_ = 0xff800000;
        auVar266._24_4_ = 0xff800000;
        auVar266._28_4_ = 0xff800000;
        auVar126 = vblendmps_avx512vl(auVar39,auVar266);
        auVar127._0_4_ =
             (uint)(bVar65 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar121._0_4_;
        bVar68 = (bool)(bVar65 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar68 * auVar126._4_4_ | (uint)!bVar68 * auVar121._4_4_;
        bVar68 = (bool)(bVar65 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar68 * auVar126._8_4_ | (uint)!bVar68 * auVar121._8_4_;
        bVar68 = (bool)(bVar65 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar68 * auVar126._12_4_ | (uint)!bVar68 * auVar121._12_4_;
        bVar68 = (bool)(bVar65 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar68 * auVar126._16_4_ | (uint)!bVar68 * auVar121._16_4_;
        bVar68 = (bool)(bVar65 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar68 * auVar126._20_4_ | (uint)!bVar68 * auVar121._20_4_;
        bVar68 = (bool)(bVar65 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar68 * auVar126._24_4_ | (uint)!bVar68 * auVar121._24_4_;
        auVar127._28_4_ =
             (uint)(bVar65 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar121._28_4_;
        auVar112 = vmaxps_avx512vl(auVar112,auVar127);
        auVar265 = ZEXT3264(auVar112);
        uVar18 = vcmpps_avx512vl(auVar113,auVar122,6);
        bVar65 = (byte)uVar16 | (byte)uVar18;
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar128._0_4_ =
             (uint)(bVar65 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar65 & 1) * (int)fVar248;
        bVar68 = (bool)(bVar65 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar68 * auVar113._4_4_ | (uint)!bVar68 * (int)fVar253;
        bVar68 = (bool)(bVar65 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar68 * auVar113._8_4_ | (uint)!bVar68 * (int)fVar254;
        bVar68 = (bool)(bVar65 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar68 * auVar113._12_4_ | (uint)!bVar68 * (int)fVar255;
        bVar68 = (bool)(bVar65 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar68 * auVar113._16_4_ | (uint)!bVar68 * (int)fVar225;
        bVar68 = (bool)(bVar65 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar68 * auVar113._20_4_ | (uint)!bVar68 * (int)fVar226;
        bVar68 = (bool)(bVar65 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar68 * auVar113._24_4_ | (uint)!bVar68 * (int)fVar227;
        auVar128._28_4_ =
             (uint)(bVar65 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar117._28_4_;
        auVar117 = vminps_avx512vl(auVar111,auVar128);
        auVar74 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar74),auVar103);
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar74),auVar104);
        auVar105 = vsubps_avx512vl(ZEXT1632(auVar74),auVar105);
        auVar105 = vmulps_avx512vl(auVar105,auVar109);
        auVar104 = vfmadd231ps_avx512vl(auVar105,auVar108,auVar104);
        auVar103 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar103);
        auVar104 = vmulps_avx512vl(local_5e0,auVar109);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_5c0,auVar108);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_5a0,auVar107);
        auVar269 = ZEXT3264(auVar125);
        vandps_avx512vl(auVar104,auVar114);
        uVar16 = vcmpps_avx512vl(auVar125,auVar115,1);
        auVar103 = vxorps_avx512vl(auVar103,auVar83);
        auVar105 = vrcp14ps_avx512vl(auVar104);
        auVar107 = vxorps_avx512vl(auVar104,auVar83);
        auVar261 = ZEXT3264(auVar107);
        auVar83 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar125);
        auVar73 = vfmadd132ps_fma(auVar83,auVar105,auVar105);
        fVar248 = auVar73._0_4_ * auVar103._0_4_;
        fVar253 = auVar73._4_4_ * auVar103._4_4_;
        auVar40._4_4_ = fVar253;
        auVar40._0_4_ = fVar248;
        fVar254 = auVar73._8_4_ * auVar103._8_4_;
        auVar40._8_4_ = fVar254;
        fVar255 = auVar73._12_4_ * auVar103._12_4_;
        auVar40._12_4_ = fVar255;
        fVar225 = auVar103._16_4_ * 0.0;
        auVar40._16_4_ = fVar225;
        fVar226 = auVar103._20_4_ * 0.0;
        auVar40._20_4_ = fVar226;
        fVar227 = auVar103._24_4_ * 0.0;
        auVar40._24_4_ = fVar227;
        auVar40._28_4_ = auVar103._28_4_;
        uVar18 = vcmpps_avx512vl(auVar104,auVar107,1);
        bVar65 = (byte)uVar16 | (byte)uVar18;
        auVar83 = vblendmps_avx512vl(auVar40,auVar266);
        auVar129._0_4_ =
             (uint)(bVar65 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar105._0_4_;
        bVar68 = (bool)(bVar65 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar68 * auVar83._4_4_ | (uint)!bVar68 * auVar105._4_4_;
        bVar68 = (bool)(bVar65 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar68 * auVar83._8_4_ | (uint)!bVar68 * auVar105._8_4_;
        bVar68 = (bool)(bVar65 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar68 * auVar83._12_4_ | (uint)!bVar68 * auVar105._12_4_;
        bVar68 = (bool)(bVar65 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar68 * auVar83._16_4_ | (uint)!bVar68 * auVar105._16_4_;
        bVar68 = (bool)(bVar65 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar68 * auVar83._20_4_ | (uint)!bVar68 * auVar105._20_4_;
        bVar68 = (bool)(bVar65 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar68 * auVar83._24_4_ | (uint)!bVar68 * auVar105._24_4_;
        auVar129._28_4_ =
             (uint)(bVar65 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar105._28_4_;
        auVar83 = vmaxps_avx(auVar112,auVar129);
        auVar259 = ZEXT3264(auVar83);
        uVar18 = vcmpps_avx512vl(auVar104,auVar107,6);
        bVar65 = (byte)uVar16 | (byte)uVar18;
        auVar130._0_4_ =
             (uint)(bVar65 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar65 & 1) * (int)fVar248;
        bVar68 = (bool)(bVar65 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar68 * auVar113._4_4_ | (uint)!bVar68 * (int)fVar253;
        bVar68 = (bool)(bVar65 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar68 * auVar113._8_4_ | (uint)!bVar68 * (int)fVar254;
        bVar68 = (bool)(bVar65 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar68 * auVar113._12_4_ | (uint)!bVar68 * (int)fVar255;
        bVar68 = (bool)(bVar65 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar68 * auVar113._16_4_ | (uint)!bVar68 * (int)fVar225;
        bVar68 = (bool)(bVar65 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar68 * auVar113._20_4_ | (uint)!bVar68 * (int)fVar226;
        bVar68 = (bool)(bVar65 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar68 * auVar113._24_4_ | (uint)!bVar68 * (int)fVar227;
        auVar130._28_4_ =
             (uint)(bVar65 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar103._28_4_;
        local_340 = vminps_avx(auVar117,auVar130);
        auVar257 = ZEXT3264(local_340);
        uVar16 = vcmpps_avx512vl(auVar83,local_340,2);
        bVar55 = bVar55 & 0x7f & (byte)uVar16;
        if (bVar55 == 0) goto LAB_019dc988;
        auVar104 = vmaxps_avx512vl(ZEXT1632(auVar74),auVar82);
        auVar82 = vfmadd213ps_avx512vl(local_600,auVar118,auVar110);
        fVar248 = auVar106._0_4_;
        fVar253 = auVar106._4_4_;
        auVar41._4_4_ = fVar253 * auVar82._4_4_;
        auVar41._0_4_ = fVar248 * auVar82._0_4_;
        fVar254 = auVar106._8_4_;
        auVar41._8_4_ = fVar254 * auVar82._8_4_;
        fVar255 = auVar106._12_4_;
        auVar41._12_4_ = fVar255 * auVar82._12_4_;
        fVar225 = auVar106._16_4_;
        auVar41._16_4_ = fVar225 * auVar82._16_4_;
        fVar226 = auVar106._20_4_;
        auVar41._20_4_ = fVar226 * auVar82._20_4_;
        fVar227 = auVar106._24_4_;
        auVar41._24_4_ = fVar227 * auVar82._24_4_;
        auVar41._28_4_ = auVar82._28_4_;
        auVar82 = vfmadd213ps_avx512vl(local_640,auVar118,auVar110);
        auVar42._4_4_ = fVar253 * auVar82._4_4_;
        auVar42._0_4_ = fVar248 * auVar82._0_4_;
        auVar42._8_4_ = fVar254 * auVar82._8_4_;
        auVar42._12_4_ = fVar255 * auVar82._12_4_;
        auVar42._16_4_ = fVar225 * auVar82._16_4_;
        auVar42._20_4_ = fVar226 * auVar82._20_4_;
        auVar42._24_4_ = fVar227 * auVar82._24_4_;
        auVar42._28_4_ = auVar82._28_4_;
        auVar82 = vminps_avx512vl(auVar41,auVar125);
        auVar49 = ZEXT812(0);
        auVar103 = ZEXT1232(auVar49) << 0x20;
        auVar82 = vmaxps_avx(auVar82,ZEXT1232(auVar49) << 0x20);
        auVar105 = vminps_avx512vl(auVar42,auVar125);
        auVar43._4_4_ = (auVar82._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar82._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar82._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar82._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar82._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar82._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar82._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar82._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar43,auVar153,auVar231);
        auVar82 = vmaxps_avx(auVar105,ZEXT1232(auVar49) << 0x20);
        auVar44._4_4_ = (auVar82._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar82._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar82._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar82._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar82._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar82._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar82._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar82._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar44,auVar153,auVar231);
        auVar45._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar45._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar45._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar45._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar45._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar45._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar45._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar45._28_4_ = auVar104._28_4_;
        auVar82 = vsubps_avx(local_7e0,auVar45);
        local_880 = auVar96._0_4_;
        fStack_87c = auVar96._4_4_;
        fStack_878 = auVar96._8_4_;
        fStack_874 = auVar96._12_4_;
        fStack_870 = auVar96._16_4_;
        fStack_86c = auVar96._20_4_;
        fStack_868 = auVar96._24_4_;
        auVar46._4_4_ = auVar82._4_4_ * fStack_87c;
        auVar46._0_4_ = auVar82._0_4_ * local_880;
        auVar46._8_4_ = auVar82._8_4_ * fStack_878;
        auVar46._12_4_ = auVar82._12_4_ * fStack_874;
        auVar46._16_4_ = auVar82._16_4_ * fStack_870;
        auVar46._20_4_ = auVar82._20_4_ * fStack_86c;
        auVar46._24_4_ = auVar82._24_4_ * fStack_868;
        auVar46._28_4_ = auVar104._28_4_;
        auVar96 = vsubps_avx(local_720,auVar46);
        uVar16 = vcmpps_avx512vl(auVar96,ZEXT1232(auVar49) << 0x20,5);
        bVar65 = (byte)uVar16;
        if (bVar65 == 0) {
          bVar65 = 0;
          auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar247 = ZEXT864(0) << 0x20;
          auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar259 = ZEXT864(0) << 0x20;
          auVar131._8_4_ = 0x7f800000;
          auVar131._0_8_ = 0x7f8000007f800000;
          auVar131._12_4_ = 0x7f800000;
          auVar131._16_4_ = 0x7f800000;
          auVar131._20_4_ = 0x7f800000;
          auVar131._24_4_ = 0x7f800000;
          auVar131._28_4_ = 0x7f800000;
          auVar132._8_4_ = 0xff800000;
          auVar132._0_8_ = 0xff800000ff800000;
          auVar132._12_4_ = 0xff800000;
          auVar132._16_4_ = 0xff800000;
          auVar132._20_4_ = 0xff800000;
          auVar132._24_4_ = 0xff800000;
          auVar132._28_4_ = 0xff800000;
        }
        else {
          auVar74 = vxorps_avx512vl(auVar145,auVar145);
          uVar69 = vcmpps_avx512vl(auVar96,ZEXT1232(ZEXT812(0)) << 0x20,5);
          auVar96 = vsqrtps_avx(auVar96);
          auVar103 = vfnmadd213ps_avx512vl(auVar119,auVar120,auVar125);
          auVar104 = vfmadd132ps_avx512vl(auVar103,auVar120,auVar120);
          auVar103 = vsubps_avx(_local_620,auVar96);
          auVar107 = vmulps_avx512vl(auVar103,auVar104);
          auVar96 = vsubps_avx512vl(auVar96,auVar116);
          auVar108 = vmulps_avx512vl(auVar96,auVar104);
          auVar96 = vfmadd213ps_avx512vl(auVar118,auVar107,auVar110);
          auVar47._4_4_ = fVar253 * auVar96._4_4_;
          auVar47._0_4_ = fVar248 * auVar96._0_4_;
          auVar47._8_4_ = fVar254 * auVar96._8_4_;
          auVar47._12_4_ = fVar255 * auVar96._12_4_;
          auVar47._16_4_ = fVar225 * auVar96._16_4_;
          auVar47._20_4_ = fVar226 * auVar96._20_4_;
          auVar47._24_4_ = fVar227 * auVar96._24_4_;
          auVar47._28_4_ = auVar105._28_4_;
          auVar96 = vmulps_avx512vl(local_5a0,auVar107);
          auVar103 = vmulps_avx512vl(local_5c0,auVar107);
          auVar105 = vmulps_avx512vl(local_5e0,auVar107);
          auVar104 = vfmadd213ps_avx512vl(auVar97,auVar47,auVar100);
          auVar96 = vsubps_avx512vl(auVar96,auVar104);
          auVar104 = vfmadd213ps_avx512vl(auVar98,auVar47,auVar101);
          auVar104 = vsubps_avx512vl(auVar103,auVar104);
          auVar73 = vfmadd213ps_fma(auVar47,auVar99,auVar102);
          auVar103 = vsubps_avx(auVar105,ZEXT1632(auVar73));
          auVar259 = ZEXT3264(auVar103);
          auVar103 = vfmadd213ps_avx512vl(auVar118,auVar108,auVar110);
          auVar105 = vmulps_avx512vl(auVar106,auVar103);
          auVar103 = vmulps_avx512vl(local_5a0,auVar108);
          auVar106 = vmulps_avx512vl(local_5c0,auVar108);
          auVar109 = vmulps_avx512vl(local_5e0,auVar108);
          auVar73 = vfmadd213ps_fma(auVar97,auVar105,auVar100);
          auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar73));
          auVar73 = vfmadd213ps_fma(auVar98,auVar105,auVar101);
          auVar97 = vsubps_avx512vl(auVar106,ZEXT1632(auVar73));
          auVar73 = vfmadd213ps_fma(auVar99,auVar105,auVar102);
          auVar98 = vsubps_avx512vl(auVar109,ZEXT1632(auVar73));
          auVar247 = ZEXT3264(auVar98);
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar98 = vblendmps_avx512vl(auVar154,auVar107);
          bVar68 = (bool)((byte)uVar69 & 1);
          auVar131._0_4_ = (uint)bVar68 * auVar98._0_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar68 * auVar98._4_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar68 * auVar98._8_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar68 * auVar98._12_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar131._16_4_ = (uint)bVar68 * auVar98._16_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar131._20_4_ = (uint)bVar68 * auVar98._20_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar131._24_4_ = (uint)bVar68 * auVar98._24_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = SUB81(uVar69 >> 7,0);
          auVar131._28_4_ = (uint)bVar68 * auVar98._28_4_ | (uint)!bVar68 * 0x7f800000;
          auVar203._8_4_ = 0xff800000;
          auVar203._0_8_ = 0xff800000ff800000;
          auVar203._12_4_ = 0xff800000;
          auVar203._16_4_ = 0xff800000;
          auVar203._20_4_ = 0xff800000;
          auVar203._24_4_ = 0xff800000;
          auVar203._28_4_ = 0xff800000;
          auVar98 = vblendmps_avx512vl(auVar203,auVar108);
          bVar68 = (bool)((byte)uVar69 & 1);
          auVar132._0_4_ = (uint)bVar68 * auVar98._0_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar68 * auVar98._4_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar68 * auVar98._8_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar68 * auVar98._12_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar132._16_4_ = (uint)bVar68 * auVar98._16_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar132._20_4_ = (uint)bVar68 * auVar98._20_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar132._24_4_ = (uint)bVar68 * auVar98._24_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = SUB81(uVar69 >> 7,0);
          auVar132._28_4_ = (uint)bVar68 * auVar98._28_4_ | (uint)!bVar68 * -0x800000;
          auVar27._8_4_ = 0x36000000;
          auVar27._0_8_ = 0x3600000036000000;
          auVar27._12_4_ = 0x36000000;
          auVar27._16_4_ = 0x36000000;
          auVar27._20_4_ = 0x36000000;
          auVar27._24_4_ = 0x36000000;
          auVar27._28_4_ = 0x36000000;
          auVar98 = vmulps_avx512vl(local_660,auVar27);
          uVar61 = vcmpps_avx512vl(auVar98,local_680,0xe);
          uVar69 = uVar69 & uVar61;
          bVar60 = (byte)uVar69;
          if (bVar60 != 0) {
            uVar61 = vcmpps_avx512vl(auVar82,ZEXT1632(auVar74),2);
            auVar251._8_4_ = 0x7f800000;
            auVar251._0_8_ = 0x7f8000007f800000;
            auVar251._12_4_ = 0x7f800000;
            auVar251._16_4_ = 0x7f800000;
            auVar251._20_4_ = 0x7f800000;
            auVar251._24_4_ = 0x7f800000;
            auVar251._28_4_ = 0x7f800000;
            auVar264._8_4_ = 0xff800000;
            auVar264._0_8_ = 0xff800000ff800000;
            auVar264._12_4_ = 0xff800000;
            auVar264._16_4_ = 0xff800000;
            auVar264._20_4_ = 0xff800000;
            auVar264._24_4_ = 0xff800000;
            auVar264._28_4_ = 0xff800000;
            auVar82 = vblendmps_avx512vl(auVar251,auVar264);
            bVar56 = (byte)uVar61;
            uVar70 = (uint)(bVar56 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar98._0_4_;
            bVar68 = (bool)((byte)(uVar61 >> 1) & 1);
            uVar136 = (uint)bVar68 * auVar82._4_4_ | (uint)!bVar68 * auVar98._4_4_;
            bVar68 = (bool)((byte)(uVar61 >> 2) & 1);
            uVar137 = (uint)bVar68 * auVar82._8_4_ | (uint)!bVar68 * auVar98._8_4_;
            bVar68 = (bool)((byte)(uVar61 >> 3) & 1);
            uVar138 = (uint)bVar68 * auVar82._12_4_ | (uint)!bVar68 * auVar98._12_4_;
            bVar68 = (bool)((byte)(uVar61 >> 4) & 1);
            uVar139 = (uint)bVar68 * auVar82._16_4_ | (uint)!bVar68 * auVar98._16_4_;
            bVar68 = (bool)((byte)(uVar61 >> 5) & 1);
            uVar140 = (uint)bVar68 * auVar82._20_4_ | (uint)!bVar68 * auVar98._20_4_;
            bVar68 = (bool)((byte)(uVar61 >> 6) & 1);
            uVar141 = (uint)bVar68 * auVar82._24_4_ | (uint)!bVar68 * auVar98._24_4_;
            bVar68 = SUB81(uVar61 >> 7,0);
            uVar142 = (uint)bVar68 * auVar82._28_4_ | (uint)!bVar68 * auVar98._28_4_;
            auVar131._0_4_ = (bVar60 & 1) * uVar70 | !(bool)(bVar60 & 1) * auVar131._0_4_;
            bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar131._4_4_ = bVar68 * uVar136 | !bVar68 * auVar131._4_4_;
            bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar131._8_4_ = bVar68 * uVar137 | !bVar68 * auVar131._8_4_;
            bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar131._12_4_ = bVar68 * uVar138 | !bVar68 * auVar131._12_4_;
            bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar131._16_4_ = bVar68 * uVar139 | !bVar68 * auVar131._16_4_;
            bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar131._20_4_ = bVar68 * uVar140 | !bVar68 * auVar131._20_4_;
            bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar131._24_4_ = bVar68 * uVar141 | !bVar68 * auVar131._24_4_;
            bVar68 = SUB81(uVar69 >> 7,0);
            auVar131._28_4_ = bVar68 * uVar142 | !bVar68 * auVar131._28_4_;
            auVar82 = vblendmps_avx512vl(auVar264,auVar251);
            bVar68 = (bool)((byte)(uVar61 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar61 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar61 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar61 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar61 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar61 >> 6) & 1);
            bVar11 = SUB81(uVar61 >> 7,0);
            auVar132._0_4_ =
                 (uint)(bVar60 & 1) *
                 ((uint)(bVar56 & 1) * auVar82._0_4_ | !(bool)(bVar56 & 1) * uVar70) |
                 !(bool)(bVar60 & 1) * auVar132._0_4_;
            bVar5 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar132._4_4_ =
                 (uint)bVar5 * ((uint)bVar68 * auVar82._4_4_ | !bVar68 * uVar136) |
                 !bVar5 * auVar132._4_4_;
            bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar132._8_4_ =
                 (uint)bVar68 * ((uint)bVar6 * auVar82._8_4_ | !bVar6 * uVar137) |
                 !bVar68 * auVar132._8_4_;
            bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar132._12_4_ =
                 (uint)bVar68 * ((uint)bVar7 * auVar82._12_4_ | !bVar7 * uVar138) |
                 !bVar68 * auVar132._12_4_;
            bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar132._16_4_ =
                 (uint)bVar68 * ((uint)bVar8 * auVar82._16_4_ | !bVar8 * uVar139) |
                 !bVar68 * auVar132._16_4_;
            bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar132._20_4_ =
                 (uint)bVar68 * ((uint)bVar9 * auVar82._20_4_ | !bVar9 * uVar140) |
                 !bVar68 * auVar132._20_4_;
            bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar132._24_4_ =
                 (uint)bVar68 * ((uint)bVar10 * auVar82._24_4_ | !bVar10 * uVar141) |
                 !bVar68 * auVar132._24_4_;
            bVar68 = SUB81(uVar69 >> 7,0);
            auVar132._28_4_ =
                 (uint)bVar68 * ((uint)bVar11 * auVar82._28_4_ | !bVar11 * uVar142) |
                 !bVar68 * auVar132._28_4_;
            bVar65 = (~bVar60 | bVar56) & bVar65;
          }
        }
        auVar252._0_4_ = local_5e0._0_4_ * auVar247._0_4_;
        auVar252._4_4_ = local_5e0._4_4_ * auVar247._4_4_;
        auVar252._8_4_ = local_5e0._8_4_ * auVar247._8_4_;
        auVar252._12_4_ = local_5e0._12_4_ * auVar247._12_4_;
        auVar252._16_4_ = local_5e0._16_4_ * auVar247._16_4_;
        auVar252._20_4_ = local_5e0._20_4_ * auVar247._20_4_;
        auVar252._28_36_ = auVar247._28_36_;
        auVar252._24_4_ = local_5e0._24_4_ * auVar247._24_4_;
        auVar265 = ZEXT3264(local_5c0);
        auVar73 = vfmadd231ps_fma(auVar252._0_32_,local_5c0,auVar97);
        auVar252 = ZEXT3264(local_5a0);
        auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_5a0,auVar103);
        auVar246._8_4_ = 0x7fffffff;
        auVar246._0_8_ = 0x7fffffff7fffffff;
        auVar246._12_4_ = 0x7fffffff;
        auVar246._16_4_ = 0x7fffffff;
        auVar246._20_4_ = 0x7fffffff;
        auVar246._24_4_ = 0x7fffffff;
        auVar246._28_4_ = 0x7fffffff;
        auVar247 = ZEXT3264(auVar246);
        auVar82 = vandps_avx(ZEXT1632(auVar73),auVar246);
        auVar261 = ZEXT3264(auVar83);
        _local_1c0 = auVar83;
        auVar243._8_4_ = 0x3e99999a;
        auVar243._0_8_ = 0x3e99999a3e99999a;
        auVar243._12_4_ = 0x3e99999a;
        auVar243._16_4_ = 0x3e99999a;
        auVar243._20_4_ = 0x3e99999a;
        auVar243._24_4_ = 0x3e99999a;
        auVar243._28_4_ = 0x3e99999a;
        uVar16 = vcmpps_avx512vl(auVar82,auVar243,1);
        _local_560 = vmaxps_avx(auVar83,auVar132);
        _local_360 = _local_560;
        auVar82 = vminps_avx(local_340,auVar131);
        uVar18 = vcmpps_avx512vl(auVar83,auVar82,2);
        bVar60 = (byte)uVar18 & bVar55;
        uVar17 = vcmpps_avx512vl(_local_560,local_340,2);
        if ((bVar55 & ((byte)uVar17 | (byte)uVar18)) == 0) {
          auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar269 = ZEXT3264(auVar82);
          auVar241 = ZEXT3264(_DAT_01f7b040);
        }
        else {
          bVar56 = (byte)uVar16 | ~bVar65;
          auVar48._4_4_ = local_5e0._4_4_ * auVar259._4_4_;
          auVar48._0_4_ = local_5e0._0_4_ * auVar259._0_4_;
          auVar48._8_4_ = local_5e0._8_4_ * auVar259._8_4_;
          auVar48._12_4_ = local_5e0._12_4_ * auVar259._12_4_;
          auVar48._16_4_ = local_5e0._16_4_ * auVar259._16_4_;
          auVar48._20_4_ = local_5e0._20_4_ * auVar259._20_4_;
          auVar48._24_4_ = local_5e0._24_4_ * auVar259._24_4_;
          auVar48._28_4_ = auVar82._28_4_;
          auVar73 = vfmadd213ps_fma(auVar104,local_5c0,auVar48);
          auVar73 = vfmadd213ps_fma(auVar96,local_5a0,ZEXT1632(auVar73));
          auVar82 = vandps_avx(ZEXT1632(auVar73),auVar246);
          uVar16 = vcmpps_avx512vl(auVar82,auVar243,1);
          bVar65 = (byte)uVar16 | ~bVar65;
          auVar155._8_4_ = 2;
          auVar155._0_8_ = 0x200000002;
          auVar155._12_4_ = 2;
          auVar155._16_4_ = 2;
          auVar155._20_4_ = 2;
          auVar155._24_4_ = 2;
          auVar155._28_4_ = 2;
          auVar28._8_4_ = 3;
          auVar28._0_8_ = 0x300000003;
          auVar28._12_4_ = 3;
          auVar28._16_4_ = 3;
          auVar28._20_4_ = 3;
          auVar28._24_4_ = 3;
          auVar28._28_4_ = 3;
          auVar82 = vpblendmd_avx512vl(auVar155,auVar28);
          local_320._0_4_ = (uint)(bVar65 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar65 & 1) * 2;
          bVar68 = (bool)(bVar65 >> 1 & 1);
          local_320._4_4_ = (uint)bVar68 * auVar82._4_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar65 >> 2 & 1);
          local_320._8_4_ = (uint)bVar68 * auVar82._8_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar65 >> 3 & 1);
          local_320._12_4_ = (uint)bVar68 * auVar82._12_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar65 >> 4 & 1);
          local_320._16_4_ = (uint)bVar68 * auVar82._16_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar65 >> 5 & 1);
          local_320._20_4_ = (uint)bVar68 * auVar82._20_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar65 >> 6 & 1);
          local_320._24_4_ = (uint)bVar68 * auVar82._24_4_ | (uint)!bVar68 * 2;
          local_320._28_4_ = (uint)(bVar65 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar65 >> 7) * 2;
          local_4e0 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpd_avx512vl(local_4e0,local_320,5);
          local_540 = auVar83._0_4_ + (float)local_580._0_4_;
          fStack_53c = auVar83._4_4_ + (float)local_580._4_4_;
          fStack_538 = auVar83._8_4_ + fStack_578;
          fStack_534 = auVar83._12_4_ + fStack_574;
          fStack_530 = auVar83._16_4_ + fStack_570;
          fStack_52c = auVar83._20_4_ + fStack_56c;
          fStack_528 = auVar83._24_4_ + fStack_568;
          fStack_524 = auVar83._28_4_ + fStack_564;
          for (bVar65 = (byte)uVar16 & bVar60; auVar82 = _local_360, bVar65 != 0;
              bVar65 = ~bVar62 & bVar65 & (byte)uVar16) {
            auVar156._8_4_ = 0x7f800000;
            auVar156._0_8_ = 0x7f8000007f800000;
            auVar156._12_4_ = 0x7f800000;
            auVar156._16_4_ = 0x7f800000;
            auVar156._20_4_ = 0x7f800000;
            auVar156._24_4_ = 0x7f800000;
            auVar156._28_4_ = 0x7f800000;
            auVar82 = vblendmps_avx512vl(auVar156,auVar83);
            auVar133._0_4_ =
                 (uint)(bVar65 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar68 * auVar82._4_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar68 * auVar82._8_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar68 * auVar82._12_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar68 * auVar82._16_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar68 * auVar82._20_4_ | (uint)!bVar68 * 0x7f800000;
            auVar133._24_4_ =
                 (uint)(bVar65 >> 6) * auVar82._24_4_ | (uint)!(bool)(bVar65 >> 6) * 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar82 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar82 = vminps_avx(auVar133,auVar82);
            auVar97 = vshufpd_avx(auVar82,auVar82,5);
            auVar82 = vminps_avx(auVar82,auVar97);
            auVar97 = vpermpd_avx2(auVar82,0x4e);
            auVar82 = vminps_avx(auVar82,auVar97);
            uVar16 = vcmpps_avx512vl(auVar133,auVar82,0);
            bVar57 = (byte)uVar16 & bVar65;
            bVar62 = bVar65;
            if (bVar57 != 0) {
              bVar62 = bVar57;
            }
            iVar19 = 0;
            for (uVar70 = (uint)bVar62; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar62 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar70 = *(uint *)(local_1e0 + (uint)(iVar19 << 2));
            uVar136 = *(uint *)(local_1c0 + (uint)(iVar19 << 2));
            fVar248 = auVar14._0_4_;
            if ((float)local_7c0._0_4_ < 0.0) {
              auVar252 = ZEXT1664(auVar252._0_16_);
              auVar259 = ZEXT1664(auVar259._0_16_);
              auVar261 = ZEXT1664(auVar261._0_16_);
              auVar265 = ZEXT1664(auVar265._0_16_);
              fVar248 = sqrtf((float)local_7c0._0_4_);
            }
            auVar247 = ZEXT464(uVar136);
            uVar69 = (ulong)bVar62;
            auVar74 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar73 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar71 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar1 = vminps_avx(auVar74,auVar71);
            auVar74 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar71 = vmaxps_avx(auVar73,auVar74);
            auVar210._8_4_ = 0x7fffffff;
            auVar210._0_8_ = 0x7fffffff7fffffff;
            auVar210._12_4_ = 0x7fffffff;
            auVar73 = vandps_avx(auVar1,auVar210);
            auVar74 = vandps_avx(auVar71,auVar210);
            auVar73 = vmaxps_avx(auVar73,auVar74);
            auVar74 = vmovshdup_avx(auVar73);
            auVar74 = vmaxss_avx(auVar74,auVar73);
            auVar73 = vshufpd_avx(auVar73,auVar73,1);
            auVar73 = vmaxss_avx(auVar73,auVar74);
            fVar253 = auVar73._0_4_ * 1.9073486e-06;
            local_6d0 = vshufps_avx(auVar71,auVar71,0xff);
            auVar73 = vinsertps_avx(ZEXT416(uVar136),ZEXT416(uVar70),0x10);
            auVar257 = ZEXT1664(auVar73);
            uVar61 = 0;
            while( true ) {
              bVar57 = (byte)uVar69;
              if (uVar61 == 5) break;
              uVar167 = auVar257._0_4_;
              auVar146._4_4_ = uVar167;
              auVar146._0_4_ = uVar167;
              auVar146._8_4_ = uVar167;
              auVar146._12_4_ = uVar167;
              auVar73 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_7b0);
              local_720 = auVar257._0_32_;
              auVar74 = vmovshdup_avx(auVar257._0_16_);
              fVar236 = auVar74._0_4_;
              fVar209 = 1.0 - fVar236;
              fVar255 = fVar209 * fVar209 * fVar209;
              fVar227 = fVar236 * fVar236 * fVar236;
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar255),
                                        ZEXT416((uint)fVar227));
              fVar254 = fVar236 * fVar209;
              auVar228 = ZEXT416((uint)fVar209);
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar236 * 6.0)),
                                        ZEXT416((uint)(fVar254 * fVar209)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar227),
                                       ZEXT416((uint)fVar255));
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar209 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar254 * fVar236)));
              fVar255 = fVar255 * 0.16666667;
              fVar225 = (auVar71._0_4_ + auVar75._0_4_) * 0.16666667;
              fVar226 = (auVar1._0_4_ + auVar72._0_4_) * 0.16666667;
              fVar227 = fVar227 * 0.16666667;
              auVar185._0_4_ = fVar227 * (float)local_7a0._0_4_;
              auVar185._4_4_ = fVar227 * (float)local_7a0._4_4_;
              auVar185._8_4_ = fVar227 * fStack_798;
              auVar185._12_4_ = fVar227 * fStack_794;
              auVar229._4_4_ = fVar226;
              auVar229._0_4_ = fVar226;
              auVar229._8_4_ = fVar226;
              auVar229._12_4_ = fVar226;
              auVar71 = vfmadd132ps_fma(auVar229,auVar185,local_760._0_16_);
              auVar186._4_4_ = fVar225;
              auVar186._0_4_ = fVar225;
              auVar186._8_4_ = fVar225;
              auVar186._12_4_ = fVar225;
              auVar71 = vfmadd132ps_fma(auVar186,auVar71,local_780._0_16_);
              auVar168._4_4_ = fVar255;
              auVar168._0_4_ = fVar255;
              auVar168._8_4_ = fVar255;
              auVar168._12_4_ = fVar255;
              auVar71 = vfmadd132ps_fma(auVar168,auVar71,local_740._0_16_);
              local_600._0_16_ = auVar71;
              auVar71 = vsubps_avx(auVar73,auVar71);
              auVar73 = vdpps_avx(auVar71,auVar71,0x7f);
              local_7e0._0_16_ = auVar73;
              if (auVar73._0_4_ < 0.0) {
                auVar247._0_4_ = sqrtf(auVar73._0_4_);
                auVar247._4_60_ = extraout_var;
                auVar73 = auVar247._0_16_;
                uVar69 = extraout_RAX;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
              }
              local_620._4_4_ = fVar209;
              local_620._0_4_ = fVar209;
              fStack_618 = fVar209;
              fStack_614 = fVar209;
              auVar75 = vfnmsub213ss_fma(auVar74,auVar74,ZEXT416((uint)(fVar254 * 4.0)));
              auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * 4.0)),auVar228,auVar228);
              fVar254 = fVar209 * -fVar209 * 0.5;
              fVar255 = auVar75._0_4_ * 0.5;
              fVar225 = auVar1._0_4_ * 0.5;
              fVar226 = fVar236 * fVar236 * 0.5;
              auVar211._0_4_ = fVar226 * (float)local_7a0._0_4_;
              auVar211._4_4_ = fVar226 * (float)local_7a0._4_4_;
              auVar211._8_4_ = fVar226 * fStack_798;
              auVar211._12_4_ = fVar226 * fStack_794;
              auVar169._4_4_ = fVar225;
              auVar169._0_4_ = fVar225;
              auVar169._8_4_ = fVar225;
              auVar169._12_4_ = fVar225;
              auVar1 = vfmadd132ps_fma(auVar169,auVar211,local_760._0_16_);
              auVar187._4_4_ = fVar255;
              auVar187._0_4_ = fVar255;
              auVar187._8_4_ = fVar255;
              auVar187._12_4_ = fVar255;
              auVar1 = vfmadd132ps_fma(auVar187,auVar1,local_780._0_16_);
              auVar262._4_4_ = fVar254;
              auVar262._0_4_ = fVar254;
              auVar262._8_4_ = fVar254;
              auVar262._12_4_ = fVar254;
              auVar1 = vfmadd132ps_fma(auVar262,auVar1,local_740._0_16_);
              local_640._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
              auVar50._12_4_ = 0;
              auVar50._0_12_ = ZEXT812(0);
              fVar254 = local_640._0_4_;
              auVar75 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar254));
              fVar255 = auVar75._0_4_;
              local_660._0_16_ = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar254));
              auVar75 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
              local_680._0_4_ = auVar75._0_4_;
              uVar70 = auVar73._0_4_;
              if (fVar254 < -fVar254) {
                fVar225 = sqrtf(fVar254);
                auVar73 = ZEXT416(uVar70);
                uVar69 = extraout_RAX_00;
              }
              else {
                auVar75 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                fVar225 = auVar75._0_4_;
              }
              fVar254 = fVar255 * 1.5 + fVar254 * -0.5 * fVar255 * fVar255 * fVar255;
              auVar147._0_4_ = auVar1._0_4_ * fVar254;
              auVar147._4_4_ = auVar1._4_4_ * fVar254;
              auVar147._8_4_ = auVar1._8_4_ * fVar254;
              auVar147._12_4_ = auVar1._12_4_ * fVar254;
              auVar75 = vdpps_avx(auVar71,auVar147,0x7f);
              fVar227 = auVar73._0_4_;
              fVar255 = auVar75._0_4_;
              auVar148._0_4_ = fVar255 * fVar255;
              auVar148._4_4_ = auVar75._4_4_ * auVar75._4_4_;
              auVar148._8_4_ = auVar75._8_4_ * auVar75._8_4_;
              auVar148._12_4_ = auVar75._12_4_ * auVar75._12_4_;
              auVar72 = vsubps_avx(local_7e0._0_16_,auVar148);
              fVar226 = auVar72._0_4_;
              auVar170._4_12_ = ZEXT812(0) << 0x20;
              auVar170._0_4_ = fVar226;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
              auVar77 = vmulss_avx512f(auVar76,ZEXT416(0x3fc00000));
              auVar78 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
              if (fVar226 < 0.0) {
                local_690._0_4_ = fVar225;
                local_6b0._0_4_ = auVar77._0_4_;
                local_6c0._4_4_ = fVar254;
                local_6c0._0_4_ = fVar254;
                fStack_6b8 = fVar254;
                fStack_6b4 = fVar254;
                local_6a0 = auVar76;
                fVar226 = sqrtf(fVar226);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar77 = ZEXT416((uint)local_6b0._0_4_);
                auVar73 = ZEXT416(uVar70);
                uVar69 = extraout_RAX_01;
                auVar76 = local_6a0;
                fVar254 = (float)local_6c0._0_4_;
                fVar209 = (float)local_6c0._4_4_;
                fVar236 = fStack_6b8;
                fVar267 = fStack_6b4;
                fVar225 = (float)local_690._0_4_;
              }
              else {
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                fVar226 = auVar72._0_4_;
                fVar209 = fVar254;
                fVar236 = fVar254;
                fVar267 = fVar254;
              }
              auVar265 = ZEXT1664(auVar1);
              auVar261 = ZEXT1664(local_7e0._0_16_);
              auVar259 = ZEXT1664(auVar71);
              auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar228,auVar74);
              auVar228 = vfmadd213ss_fma(auVar74,SUB6416(ZEXT464(0xc0000000),0),auVar228);
              auVar81 = local_720._0_16_;
              auVar74 = vshufps_avx(auVar81,auVar81,0x55);
              auVar188._0_4_ = auVar74._0_4_ * (float)local_7a0._0_4_;
              auVar188._4_4_ = auVar74._4_4_ * (float)local_7a0._4_4_;
              auVar188._8_4_ = auVar74._8_4_ * fStack_798;
              auVar188._12_4_ = auVar74._12_4_ * fStack_794;
              auVar212._0_4_ = auVar228._0_4_;
              auVar212._4_4_ = auVar212._0_4_;
              auVar212._8_4_ = auVar212._0_4_;
              auVar212._12_4_ = auVar212._0_4_;
              auVar74 = vfmadd132ps_fma(auVar212,auVar188,local_760._0_16_);
              auVar171._0_4_ = auVar72._0_4_;
              auVar171._4_4_ = auVar171._0_4_;
              auVar171._8_4_ = auVar171._0_4_;
              auVar171._12_4_ = auVar171._0_4_;
              auVar74 = vfmadd132ps_fma(auVar171,auVar74,local_780._0_16_);
              auVar74 = vfmadd132ps_fma(_local_620,auVar74,local_740._0_16_);
              auVar172._0_4_ = auVar74._0_4_ * (float)local_640._0_4_;
              auVar172._4_4_ = auVar74._4_4_ * (float)local_640._0_4_;
              auVar172._8_4_ = auVar74._8_4_ * (float)local_640._0_4_;
              auVar172._12_4_ = auVar74._12_4_ * (float)local_640._0_4_;
              auVar74 = vdpps_avx(auVar1,auVar74,0x7f);
              fVar184 = auVar74._0_4_;
              auVar189._0_4_ = auVar1._0_4_ * fVar184;
              auVar189._4_4_ = auVar1._4_4_ * fVar184;
              auVar189._8_4_ = auVar1._8_4_ * fVar184;
              auVar189._12_4_ = auVar1._12_4_ * fVar184;
              auVar74 = vsubps_avx(auVar172,auVar189);
              fVar184 = (float)local_680._0_4_ * (float)local_660._0_4_;
              auVar228 = vmaxss_avx(ZEXT416((uint)fVar253),
                                    ZEXT416((uint)(local_720._0_4_ * fVar248 * 1.9073486e-06)));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(auVar1,auVar20);
              auVar190._0_4_ = fVar254 * auVar74._0_4_ * fVar184;
              auVar190._4_4_ = fVar209 * auVar74._4_4_ * fVar184;
              auVar190._8_4_ = fVar236 * auVar74._8_4_ * fVar184;
              auVar190._12_4_ = fVar267 * auVar74._12_4_ * fVar184;
              auVar74 = vdpps_avx(auVar79,auVar147,0x7f);
              auVar72 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar253),auVar228);
              auVar73 = vdpps_avx(auVar71,auVar190,0x7f);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                        ZEXT416((uint)(fVar253 / fVar225)),auVar72);
              fVar254 = auVar74._0_4_ + auVar73._0_4_;
              auVar73 = vdpps_avx(local_7b0,auVar147,0x7f);
              auVar74 = vdpps_avx(auVar71,auVar79,0x7f);
              auVar72 = vmulss_avx512f(auVar78,auVar76);
              auVar78 = vaddss_avx512f(auVar77,ZEXT416((uint)(auVar72._0_4_ *
                                                             auVar76._0_4_ * auVar76._0_4_)));
              auVar72 = vdpps_avx(auVar71,local_7b0,0x7f);
              auVar77 = vfnmadd231ss_fma(auVar74,auVar75,ZEXT416((uint)fVar254));
              auVar72 = vfnmadd231ss_fma(auVar72,auVar75,auVar73);
              auVar74 = vpermilps_avx(local_600._0_16_,0xff);
              fVar226 = fVar226 - auVar74._0_4_;
              auVar76 = vshufps_avx(auVar1,auVar1,0xff);
              auVar74 = vfmsub213ss_fma(auVar77,auVar78,auVar76);
              auVar249._8_4_ = 0x80000000;
              auVar249._0_8_ = 0x8000000080000000;
              auVar249._12_4_ = 0x80000000;
              auVar252 = ZEXT1664(auVar249);
              auVar244._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar244._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar244._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar247 = ZEXT1664(auVar244);
              auVar72 = ZEXT416((uint)(auVar72._0_4_ * auVar78._0_4_));
              auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar254),auVar72);
              auVar74 = vinsertps_avx(auVar244,auVar72,0x1c);
              auVar237._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
              auVar237._8_4_ = auVar73._8_4_ ^ 0x80000000;
              auVar237._12_4_ = auVar73._12_4_ ^ 0x80000000;
              auVar72 = vinsertps_avx(ZEXT416((uint)fVar254),auVar237,0x10);
              auVar213._0_4_ = auVar77._0_4_;
              auVar213._4_4_ = auVar213._0_4_;
              auVar213._8_4_ = auVar213._0_4_;
              auVar213._12_4_ = auVar213._0_4_;
              auVar73 = vdivps_avx(auVar74,auVar213);
              auVar74 = vdivps_avx(auVar72,auVar213);
              auVar214._0_4_ = fVar255 * auVar73._0_4_ + fVar226 * auVar74._0_4_;
              auVar214._4_4_ = fVar255 * auVar73._4_4_ + fVar226 * auVar74._4_4_;
              auVar214._8_4_ = fVar255 * auVar73._8_4_ + fVar226 * auVar74._8_4_;
              auVar214._12_4_ = fVar255 * auVar73._12_4_ + fVar226 * auVar74._12_4_;
              auVar73 = vsubps_avx(auVar81,auVar214);
              auVar257 = ZEXT1664(auVar73);
              auVar21._8_4_ = 0x7fffffff;
              auVar21._0_8_ = 0x7fffffff7fffffff;
              auVar21._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(auVar75,auVar21);
              if (auVar74._0_4_ < auVar80._0_4_) {
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar228._0_4_)),local_6d0,
                                          ZEXT416(0x36000000));
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(ZEXT416((uint)fVar226),auVar22);
                if (auVar75._0_4_ < auVar74._0_4_) {
                  bVar68 = uVar61 < 5;
                  fVar248 = auVar73._0_4_ + (float)local_6e0._0_4_;
                  if ((fVar143 <= fVar248) &&
                     (fVar253 = *(float *)(ray + k * 4 + 0x100), fVar248 <= fVar253)) {
                    auVar74 = vmovshdup_avx(auVar73);
                    bVar57 = 0;
                    if ((auVar74._0_4_ < 0.0) || (1.0 < auVar74._0_4_)) goto LAB_019dd437;
                    auVar215._0_12_ = ZEXT812(0);
                    auVar215._12_4_ = 0;
                    auVar191._4_8_ = auVar215._4_8_;
                    auVar191._0_4_ = local_7e0._0_4_;
                    auVar191._12_4_ = 0;
                    auVar74 = vrsqrt14ss_avx512f(auVar215,auVar191);
                    fVar254 = auVar74._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar57 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_019dd437;
                      fVar254 = fVar254 * 1.5 + local_7e0._0_4_ * -0.5 * fVar254 * fVar254 * fVar254
                      ;
                      auVar192._0_4_ = auVar71._0_4_ * fVar254;
                      auVar192._4_4_ = auVar71._4_4_ * fVar254;
                      auVar192._8_4_ = auVar71._8_4_ * fVar254;
                      auVar192._12_4_ = auVar71._12_4_ * fVar254;
                      auVar228 = vfmadd213ps_fma(auVar76,auVar192,auVar1);
                      auVar74 = vshufps_avx(auVar192,auVar192,0xc9);
                      auVar75 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar193._0_4_ = auVar192._0_4_ * auVar75._0_4_;
                      auVar193._4_4_ = auVar192._4_4_ * auVar75._4_4_;
                      auVar193._8_4_ = auVar192._8_4_ * auVar75._8_4_;
                      auVar193._12_4_ = auVar192._12_4_ * auVar75._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar193,auVar1,auVar74);
                      auVar74 = vshufps_avx(auVar72,auVar72,0xc9);
                      auVar75 = vshufps_avx(auVar228,auVar228,0xc9);
                      auVar72 = vshufps_avx(auVar72,auVar72,0xd2);
                      auVar149._0_4_ = auVar228._0_4_ * auVar72._0_4_;
                      auVar149._4_4_ = auVar228._4_4_ * auVar72._4_4_;
                      auVar149._8_4_ = auVar228._8_4_ * auVar72._8_4_;
                      auVar149._12_4_ = auVar228._12_4_ * auVar72._12_4_;
                      auVar74 = vfmsub231ps_fma(auVar149,auVar74,auVar75);
                      auVar222._8_4_ = 1;
                      auVar222._0_8_ = 0x100000001;
                      auVar222._12_4_ = 1;
                      auVar222._16_4_ = 1;
                      auVar222._20_4_ = 1;
                      auVar222._24_4_ = 1;
                      auVar222._28_4_ = 1;
                      local_420 = vpermps_avx2(auVar222,ZEXT1632(auVar73));
                      auVar82 = vpermps_avx2(auVar222,ZEXT1632(auVar74));
                      auVar234._8_4_ = 2;
                      auVar234._0_8_ = 0x200000002;
                      auVar234._12_4_ = 2;
                      auVar234._16_4_ = 2;
                      auVar234._20_4_ = 2;
                      auVar234._24_4_ = 2;
                      auVar234._28_4_ = 2;
                      local_460 = vpermps_avx2(auVar234,ZEXT1632(auVar74));
                      local_440 = auVar74._0_4_;
                      local_480[0] = (RTCHitN)auVar82[0];
                      local_480[1] = (RTCHitN)auVar82[1];
                      local_480[2] = (RTCHitN)auVar82[2];
                      local_480[3] = (RTCHitN)auVar82[3];
                      local_480[4] = (RTCHitN)auVar82[4];
                      local_480[5] = (RTCHitN)auVar82[5];
                      local_480[6] = (RTCHitN)auVar82[6];
                      local_480[7] = (RTCHitN)auVar82[7];
                      local_480[8] = (RTCHitN)auVar82[8];
                      local_480[9] = (RTCHitN)auVar82[9];
                      local_480[10] = (RTCHitN)auVar82[10];
                      local_480[0xb] = (RTCHitN)auVar82[0xb];
                      local_480[0xc] = (RTCHitN)auVar82[0xc];
                      local_480[0xd] = (RTCHitN)auVar82[0xd];
                      local_480[0xe] = (RTCHitN)auVar82[0xe];
                      local_480[0xf] = (RTCHitN)auVar82[0xf];
                      local_480[0x10] = (RTCHitN)auVar82[0x10];
                      local_480[0x11] = (RTCHitN)auVar82[0x11];
                      local_480[0x12] = (RTCHitN)auVar82[0x12];
                      local_480[0x13] = (RTCHitN)auVar82[0x13];
                      local_480[0x14] = (RTCHitN)auVar82[0x14];
                      local_480[0x15] = (RTCHitN)auVar82[0x15];
                      local_480[0x16] = (RTCHitN)auVar82[0x16];
                      local_480[0x17] = (RTCHitN)auVar82[0x17];
                      local_480[0x18] = (RTCHitN)auVar82[0x18];
                      local_480[0x19] = (RTCHitN)auVar82[0x19];
                      local_480[0x1a] = (RTCHitN)auVar82[0x1a];
                      local_480[0x1b] = (RTCHitN)auVar82[0x1b];
                      local_480[0x1c] = (RTCHitN)auVar82[0x1c];
                      local_480[0x1d] = (RTCHitN)auVar82[0x1d];
                      local_480[0x1e] = (RTCHitN)auVar82[0x1e];
                      local_480[0x1f] = (RTCHitN)auVar82[0x1f];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_400 = ZEXT432(0) << 0x20;
                      local_3e0 = local_4a0._0_8_;
                      uStack_3d8 = local_4a0._8_8_;
                      uStack_3d0 = local_4a0._16_8_;
                      uStack_3c8 = local_4a0._24_8_;
                      local_3c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_3a0 = context->user->instID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_380 = context->user->instPrimID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      *(float *)(ray + k * 4 + 0x100) = fVar248;
                      local_700 = local_500;
                      local_810.valid = (int *)local_700;
                      local_810.geometryUserPtr = pGVar3->userPtr;
                      local_810.context = context->user;
                      local_810.hit = local_480;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar247 = ZEXT1664(auVar244);
                        auVar252 = ZEXT1664(auVar249);
                        auVar257 = ZEXT1664(auVar73);
                        auVar259 = ZEXT1664(auVar71);
                        auVar261 = ZEXT1664(local_7e0._0_16_);
                        auVar265 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_810);
                      }
                      if (local_700 != (undefined1  [32])0x0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar247 = ZEXT1664(auVar247._0_16_);
                          auVar252 = ZEXT1664(auVar252._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar261 = ZEXT1664(auVar261._0_16_);
                          auVar265 = ZEXT1664(auVar265._0_16_);
                          (*p_Var4)(&local_810);
                        }
                        uVar69 = vptestmd_avx512vl(local_700,local_700);
                        auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar69 & 1);
                        bVar6 = (bool)((byte)(uVar69 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar69 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar69 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar69 >> 6) & 1);
                        bVar12 = SUB81(uVar69 >> 7,0);
                        *(uint *)(local_810.ray + 0x100) =
                             (uint)bVar5 * auVar82._0_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x100);
                        *(uint *)(local_810.ray + 0x104) =
                             (uint)bVar6 * auVar82._4_4_ |
                             (uint)!bVar6 * *(int *)(local_810.ray + 0x104);
                        *(uint *)(local_810.ray + 0x108) =
                             (uint)bVar7 * auVar82._8_4_ |
                             (uint)!bVar7 * *(int *)(local_810.ray + 0x108);
                        *(uint *)(local_810.ray + 0x10c) =
                             (uint)bVar8 * auVar82._12_4_ |
                             (uint)!bVar8 * *(int *)(local_810.ray + 0x10c);
                        *(uint *)(local_810.ray + 0x110) =
                             (uint)bVar9 * auVar82._16_4_ |
                             (uint)!bVar9 * *(int *)(local_810.ray + 0x110);
                        *(uint *)(local_810.ray + 0x114) =
                             (uint)bVar10 * auVar82._20_4_ |
                             (uint)!bVar10 * *(int *)(local_810.ray + 0x114);
                        *(uint *)(local_810.ray + 0x118) =
                             (uint)bVar11 * auVar82._24_4_ |
                             (uint)!bVar11 * *(int *)(local_810.ray + 0x118);
                        *(uint *)(local_810.ray + 0x11c) =
                             (uint)bVar12 * auVar82._28_4_ |
                             (uint)!bVar12 * *(int *)(local_810.ray + 0x11c);
                        bVar57 = 1;
                        if (local_700 != (undefined1  [32])0x0) goto LAB_019dd437;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar253;
                      bVar57 = 0;
                      goto LAB_019dd437;
                    }
                  }
                  bVar57 = 0;
                  goto LAB_019dd437;
                }
              }
              uVar61 = uVar61 + 1;
            }
            bVar68 = false;
LAB_019dd437:
            bVar67 = bVar67 | bVar68 & bVar57;
            uVar167 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar239._4_4_ = uVar167;
            auVar239._0_4_ = uVar167;
            auVar239._8_4_ = uVar167;
            auVar239._12_4_ = uVar167;
            auVar239._16_4_ = uVar167;
            auVar239._20_4_ = uVar167;
            auVar239._24_4_ = uVar167;
            auVar239._28_4_ = uVar167;
            auVar241 = ZEXT3264(auVar239);
            auVar52._4_4_ = fStack_53c;
            auVar52._0_4_ = local_540;
            auVar52._8_4_ = fStack_538;
            auVar52._12_4_ = fStack_534;
            auVar52._16_4_ = fStack_530;
            auVar52._20_4_ = fStack_52c;
            auVar52._24_4_ = fStack_528;
            auVar52._28_4_ = fStack_524;
            uVar16 = vcmpps_avx512vl(auVar239,auVar52,0xd);
          }
          auVar157._0_4_ = (float)local_580._0_4_ + (float)local_560._0_4_;
          auVar157._4_4_ = (float)local_580._4_4_ + (float)local_560._4_4_;
          auVar157._8_4_ = fStack_578 + fStack_558;
          auVar157._12_4_ = fStack_574 + fStack_554;
          auVar157._16_4_ = fStack_570 + fStack_550;
          auVar157._20_4_ = fStack_56c + fStack_54c;
          auVar157._24_4_ = fStack_568 + fStack_548;
          auVar157._28_4_ = fStack_564 + fStack_544;
          uVar167 = auVar241._0_4_;
          auVar179._4_4_ = uVar167;
          auVar179._0_4_ = uVar167;
          auVar179._8_4_ = uVar167;
          auVar179._12_4_ = uVar167;
          auVar179._16_4_ = uVar167;
          auVar179._20_4_ = uVar167;
          auVar179._24_4_ = uVar167;
          auVar179._28_4_ = uVar167;
          uVar16 = vcmpps_avx512vl(auVar157,auVar179,2);
          auVar158._8_4_ = 2;
          auVar158._0_8_ = 0x200000002;
          auVar158._12_4_ = 2;
          auVar158._16_4_ = 2;
          auVar158._20_4_ = 2;
          auVar158._24_4_ = 2;
          auVar158._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar83 = vpblendmd_avx512vl(auVar158,auVar29);
          local_560._0_4_ = (uint)(bVar56 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar56 & 1) * 2;
          bVar68 = (bool)(bVar56 >> 1 & 1);
          local_560._4_4_ = (uint)bVar68 * auVar83._4_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar56 >> 2 & 1);
          fStack_558 = (float)((uint)bVar68 * auVar83._8_4_ | (uint)!bVar68 * 2);
          bVar68 = (bool)(bVar56 >> 3 & 1);
          fStack_554 = (float)((uint)bVar68 * auVar83._12_4_ | (uint)!bVar68 * 2);
          bVar68 = (bool)(bVar56 >> 4 & 1);
          fStack_550 = (float)((uint)bVar68 * auVar83._16_4_ | (uint)!bVar68 * 2);
          bVar68 = (bool)(bVar56 >> 5 & 1);
          fStack_54c = (float)((uint)bVar68 * auVar83._20_4_ | (uint)!bVar68 * 2);
          bVar68 = (bool)(bVar56 >> 6 & 1);
          fStack_548 = (float)((uint)bVar68 * auVar83._24_4_ | (uint)!bVar68 * 2);
          fStack_544 = (float)((uint)(bVar56 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar56 >> 7) * 2
                              );
          bVar55 = (byte)uVar17 & bVar55 & (byte)uVar16;
          uVar16 = vpcmpd_avx512vl(_local_560,local_4e0,2);
          local_540 = (float)local_580._0_4_ + (float)local_360._0_4_;
          fStack_53c = (float)local_580._4_4_ + (float)local_360._4_4_;
          fStack_538 = fStack_578 + fStack_358;
          fStack_534 = fStack_574 + fStack_354;
          fStack_530 = fStack_570 + fStack_350;
          fStack_52c = fStack_56c + fStack_34c;
          fStack_528 = fStack_568 + fStack_348;
          fStack_524 = fStack_564 + fStack_344;
          for (bVar65 = (byte)uVar16 & bVar55; bVar65 != 0; bVar65 = ~bVar56 & bVar65 & (byte)uVar16
              ) {
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar83 = vblendmps_avx512vl(auVar159,auVar82);
            auVar134._0_4_ =
                 (uint)(bVar65 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar68 * auVar83._4_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar68 * auVar83._8_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar68 * auVar83._12_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar68 * auVar83._16_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar65 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar68 * auVar83._20_4_ | (uint)!bVar68 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar65 >> 6) * auVar83._24_4_ | (uint)!(bool)(bVar65 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar83 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar83 = vminps_avx(auVar134,auVar83);
            auVar97 = vshufpd_avx(auVar83,auVar83,5);
            auVar83 = vminps_avx(auVar83,auVar97);
            auVar97 = vpermpd_avx2(auVar83,0x4e);
            auVar83 = vminps_avx(auVar83,auVar97);
            uVar16 = vcmpps_avx512vl(auVar134,auVar83,0);
            bVar62 = (byte)uVar16 & bVar65;
            bVar56 = bVar65;
            if (bVar62 != 0) {
              bVar56 = bVar62;
            }
            iVar19 = 0;
            for (uVar70 = (uint)bVar56; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar56 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar70 = *(uint *)(local_200 + (uint)(iVar19 << 2));
            uVar136 = *(uint *)(local_340 + (uint)(iVar19 << 2));
            fVar248 = auVar13._0_4_;
            if ((float)local_7c0._0_4_ < 0.0) {
              auVar252 = ZEXT1664(auVar252._0_16_);
              auVar259 = ZEXT1664(auVar259._0_16_);
              auVar261 = ZEXT1664(auVar261._0_16_);
              auVar265 = ZEXT1664(auVar265._0_16_);
              fVar248 = sqrtf((float)local_7c0._0_4_);
            }
            auVar247 = ZEXT464(uVar136);
            uVar69 = (ulong)bVar56;
            auVar74 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar73 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar71 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar1 = vminps_avx(auVar74,auVar71);
            auVar74 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar71 = vmaxps_avx(auVar73,auVar74);
            auVar216._8_4_ = 0x7fffffff;
            auVar216._0_8_ = 0x7fffffff7fffffff;
            auVar216._12_4_ = 0x7fffffff;
            auVar73 = vandps_avx(auVar1,auVar216);
            auVar74 = vandps_avx(auVar71,auVar216);
            auVar73 = vmaxps_avx(auVar73,auVar74);
            auVar74 = vmovshdup_avx(auVar73);
            auVar74 = vmaxss_avx(auVar74,auVar73);
            auVar73 = vshufpd_avx(auVar73,auVar73,1);
            auVar73 = vmaxss_avx(auVar73,auVar74);
            fVar253 = auVar73._0_4_ * 1.9073486e-06;
            local_6d0 = vshufps_avx(auVar71,auVar71,0xff);
            auVar73 = vinsertps_avx(ZEXT416(uVar136),ZEXT416(uVar70),0x10);
            auVar257 = ZEXT1664(auVar73);
            uVar61 = 0;
            while( true ) {
              bVar62 = (byte)uVar69;
              if (uVar61 == 5) break;
              uVar167 = auVar257._0_4_;
              auVar150._4_4_ = uVar167;
              auVar150._0_4_ = uVar167;
              auVar150._8_4_ = uVar167;
              auVar150._12_4_ = uVar167;
              auVar73 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_7b0);
              local_720 = auVar257._0_32_;
              auVar74 = vmovshdup_avx(auVar257._0_16_);
              fVar236 = auVar74._0_4_;
              fVar209 = 1.0 - fVar236;
              fVar255 = fVar209 * fVar209 * fVar209;
              fVar227 = fVar236 * fVar236 * fVar236;
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar255),
                                        ZEXT416((uint)fVar227));
              fVar254 = fVar236 * fVar209;
              auVar228 = ZEXT416((uint)fVar209);
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar236 * 6.0)),
                                        ZEXT416((uint)(fVar254 * fVar209)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar227),
                                       ZEXT416((uint)fVar255));
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar209 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar254 * fVar236)));
              fVar255 = fVar255 * 0.16666667;
              fVar225 = (auVar71._0_4_ + auVar75._0_4_) * 0.16666667;
              fVar226 = (auVar1._0_4_ + auVar72._0_4_) * 0.16666667;
              fVar227 = fVar227 * 0.16666667;
              auVar194._0_4_ = fVar227 * (float)local_7a0._0_4_;
              auVar194._4_4_ = fVar227 * (float)local_7a0._4_4_;
              auVar194._8_4_ = fVar227 * fStack_798;
              auVar194._12_4_ = fVar227 * fStack_794;
              auVar230._4_4_ = fVar226;
              auVar230._0_4_ = fVar226;
              auVar230._8_4_ = fVar226;
              auVar230._12_4_ = fVar226;
              auVar71 = vfmadd132ps_fma(auVar230,auVar194,local_760._0_16_);
              auVar195._4_4_ = fVar225;
              auVar195._0_4_ = fVar225;
              auVar195._8_4_ = fVar225;
              auVar195._12_4_ = fVar225;
              auVar71 = vfmadd132ps_fma(auVar195,auVar71,local_780._0_16_);
              auVar173._4_4_ = fVar255;
              auVar173._0_4_ = fVar255;
              auVar173._8_4_ = fVar255;
              auVar173._12_4_ = fVar255;
              auVar71 = vfmadd132ps_fma(auVar173,auVar71,local_740._0_16_);
              local_600._0_16_ = auVar71;
              auVar71 = vsubps_avx(auVar73,auVar71);
              auVar73 = vdpps_avx(auVar71,auVar71,0x7f);
              local_7e0._0_16_ = auVar73;
              if (auVar73._0_4_ < 0.0) {
                auVar257._0_4_ = sqrtf(auVar73._0_4_);
                auVar257._4_60_ = extraout_var_00;
                auVar73 = auVar257._0_16_;
                uVar69 = extraout_RAX_02;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
              }
              local_620._4_4_ = fVar209;
              local_620._0_4_ = fVar209;
              fStack_618 = fVar209;
              fStack_614 = fVar209;
              auVar75 = vfnmsub213ss_fma(auVar74,auVar74,ZEXT416((uint)(fVar254 * 4.0)));
              auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * 4.0)),auVar228,auVar228);
              fVar254 = fVar209 * -fVar209 * 0.5;
              fVar255 = auVar75._0_4_ * 0.5;
              fVar225 = auVar1._0_4_ * 0.5;
              fVar226 = fVar236 * fVar236 * 0.5;
              auVar217._0_4_ = fVar226 * (float)local_7a0._0_4_;
              auVar217._4_4_ = fVar226 * (float)local_7a0._4_4_;
              auVar217._8_4_ = fVar226 * fStack_798;
              auVar217._12_4_ = fVar226 * fStack_794;
              auVar174._4_4_ = fVar225;
              auVar174._0_4_ = fVar225;
              auVar174._8_4_ = fVar225;
              auVar174._12_4_ = fVar225;
              auVar1 = vfmadd132ps_fma(auVar174,auVar217,local_760._0_16_);
              auVar196._4_4_ = fVar255;
              auVar196._0_4_ = fVar255;
              auVar196._8_4_ = fVar255;
              auVar196._12_4_ = fVar255;
              auVar1 = vfmadd132ps_fma(auVar196,auVar1,local_780._0_16_);
              auVar263._4_4_ = fVar254;
              auVar263._0_4_ = fVar254;
              auVar263._8_4_ = fVar254;
              auVar263._12_4_ = fVar254;
              auVar1 = vfmadd132ps_fma(auVar263,auVar1,local_740._0_16_);
              local_640._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
              auVar51._12_4_ = 0;
              auVar51._0_12_ = ZEXT812(0);
              fVar254 = local_640._0_4_;
              auVar75 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar254));
              fVar255 = auVar75._0_4_;
              local_660._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar254));
              auVar75 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
              local_680._0_4_ = auVar75._0_4_;
              uVar70 = auVar73._0_4_;
              if (fVar254 < -fVar254) {
                fVar225 = sqrtf(fVar254);
                auVar73 = ZEXT416(uVar70);
                uVar69 = extraout_RAX_03;
              }
              else {
                auVar75 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                fVar225 = auVar75._0_4_;
              }
              auVar78 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar255 * 1.5 +
                                                 fVar254 * -0.5 * fVar255 * fVar255 * fVar255)));
              auVar77 = vmulps_avx512vl(auVar1,auVar78);
              auVar75 = vdpps_avx(auVar71,auVar77,0x7f);
              fVar226 = auVar73._0_4_;
              fVar254 = auVar75._0_4_;
              auVar151._0_4_ = fVar254 * fVar254;
              auVar151._4_4_ = auVar75._4_4_ * auVar75._4_4_;
              auVar151._8_4_ = auVar75._8_4_ * auVar75._8_4_;
              auVar151._12_4_ = auVar75._12_4_ * auVar75._12_4_;
              auVar72 = vsubps_avx(local_7e0._0_16_,auVar151);
              fVar255 = auVar72._0_4_;
              auVar175._4_12_ = ZEXT812(0) << 0x20;
              auVar175._0_4_ = fVar255;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar175);
              auVar80 = vmulss_avx512f(auVar76,ZEXT416(0x3fc00000));
              auVar79 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
              if (fVar255 < 0.0) {
                local_6a0._0_4_ = auVar80._0_4_;
                _local_6c0 = auVar78;
                local_6b0 = auVar77;
                local_690 = auVar76;
                fVar255 = sqrtf(fVar255);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar80 = ZEXT416((uint)local_6a0._0_4_);
                auVar73 = ZEXT416(uVar70);
                uVar69 = extraout_RAX_04;
                auVar76 = local_690;
                auVar77 = local_6b0;
                auVar78 = _local_6c0;
              }
              else {
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                fVar255 = auVar72._0_4_;
              }
              auVar265 = ZEXT1664(auVar1);
              auVar261 = ZEXT1664(local_7e0._0_16_);
              auVar259 = ZEXT1664(auVar71);
              auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar228,auVar74);
              auVar228 = vfmadd213ss_fma(auVar74,SUB6416(ZEXT464(0xc0000000),0),auVar228);
              auVar256 = local_720._0_16_;
              auVar74 = vshufps_avx(auVar256,auVar256,0x55);
              auVar197._0_4_ = auVar74._0_4_ * (float)local_7a0._0_4_;
              auVar197._4_4_ = auVar74._4_4_ * (float)local_7a0._4_4_;
              auVar197._8_4_ = auVar74._8_4_ * fStack_798;
              auVar197._12_4_ = auVar74._12_4_ * fStack_794;
              auVar218._0_4_ = auVar228._0_4_;
              auVar218._4_4_ = auVar218._0_4_;
              auVar218._8_4_ = auVar218._0_4_;
              auVar218._12_4_ = auVar218._0_4_;
              auVar74 = vfmadd132ps_fma(auVar218,auVar197,local_760._0_16_);
              auVar176._0_4_ = auVar72._0_4_;
              auVar176._4_4_ = auVar176._0_4_;
              auVar176._8_4_ = auVar176._0_4_;
              auVar176._12_4_ = auVar176._0_4_;
              auVar74 = vfmadd132ps_fma(auVar176,auVar74,local_780._0_16_);
              auVar74 = vfmadd132ps_fma(_local_620,auVar74,local_740._0_16_);
              auVar177._0_4_ = auVar74._0_4_ * (float)local_640._0_4_;
              auVar177._4_4_ = auVar74._4_4_ * (float)local_640._0_4_;
              auVar177._8_4_ = auVar74._8_4_ * (float)local_640._0_4_;
              auVar177._12_4_ = auVar74._12_4_ * (float)local_640._0_4_;
              auVar74 = vdpps_avx(auVar1,auVar74,0x7f);
              fVar227 = auVar74._0_4_;
              auVar198._0_4_ = auVar1._0_4_ * fVar227;
              auVar198._4_4_ = auVar1._4_4_ * fVar227;
              auVar198._8_4_ = auVar1._8_4_ * fVar227;
              auVar198._12_4_ = auVar1._12_4_ * fVar227;
              auVar74 = vsubps_avx(auVar177,auVar198);
              fVar227 = (float)local_680._0_4_ * (float)local_660._0_4_;
              auVar228 = vmaxss_avx(ZEXT416((uint)fVar253),
                                    ZEXT416((uint)(local_720._0_4_ * fVar248 * 1.9073486e-06)));
              auVar199._0_4_ = auVar74._0_4_ * fVar227;
              auVar199._4_4_ = auVar74._4_4_ * fVar227;
              auVar199._8_4_ = auVar74._8_4_ * fVar227;
              auVar199._12_4_ = auVar74._12_4_ * fVar227;
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(auVar1,auVar23);
              auVar78 = vmulps_avx512vl(auVar78,auVar199);
              auVar74 = vdpps_avx(auVar81,auVar77,0x7f);
              auVar72 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar253),auVar228);
              auVar73 = vdpps_avx(auVar71,auVar78,0x7f);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar226 + 1.0)),
                                        ZEXT416((uint)(fVar253 / fVar225)),auVar72);
              fVar225 = auVar74._0_4_ + auVar73._0_4_;
              auVar73 = vdpps_avx(local_7b0,auVar77,0x7f);
              auVar74 = vdpps_avx(auVar71,auVar81,0x7f);
              auVar72 = vmulss_avx512f(auVar79,auVar76);
              auVar80 = vaddss_avx512f(auVar80,ZEXT416((uint)(auVar72._0_4_ *
                                                             auVar76._0_4_ * auVar76._0_4_)));
              auVar72 = vdpps_avx(auVar71,local_7b0,0x7f);
              auVar77 = vfnmadd231ss_fma(auVar74,auVar75,ZEXT416((uint)fVar225));
              auVar72 = vfnmadd231ss_fma(auVar72,auVar75,auVar73);
              auVar74 = vpermilps_avx(local_600._0_16_,0xff);
              fVar255 = fVar255 - auVar74._0_4_;
              auVar76 = vshufps_avx(auVar1,auVar1,0xff);
              auVar74 = vfmsub213ss_fma(auVar77,auVar80,auVar76);
              auVar250._8_4_ = 0x80000000;
              auVar250._0_8_ = 0x8000000080000000;
              auVar250._12_4_ = 0x80000000;
              auVar252 = ZEXT1664(auVar250);
              auVar245._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar245._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar245._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar247 = ZEXT1664(auVar245);
              auVar72 = ZEXT416((uint)(auVar72._0_4_ * auVar80._0_4_));
              auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar225),auVar72);
              auVar74 = vinsertps_avx(auVar245,auVar72,0x1c);
              auVar238._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
              auVar238._8_4_ = auVar73._8_4_ ^ 0x80000000;
              auVar238._12_4_ = auVar73._12_4_ ^ 0x80000000;
              auVar72 = vinsertps_avx(ZEXT416((uint)fVar225),auVar238,0x10);
              auVar219._0_4_ = auVar77._0_4_;
              auVar219._4_4_ = auVar219._0_4_;
              auVar219._8_4_ = auVar219._0_4_;
              auVar219._12_4_ = auVar219._0_4_;
              auVar73 = vdivps_avx(auVar74,auVar219);
              auVar74 = vdivps_avx(auVar72,auVar219);
              auVar220._0_4_ = fVar254 * auVar73._0_4_ + fVar255 * auVar74._0_4_;
              auVar220._4_4_ = fVar254 * auVar73._4_4_ + fVar255 * auVar74._4_4_;
              auVar220._8_4_ = fVar254 * auVar73._8_4_ + fVar255 * auVar74._8_4_;
              auVar220._12_4_ = fVar254 * auVar73._12_4_ + fVar255 * auVar74._12_4_;
              auVar73 = vsubps_avx(auVar256,auVar220);
              auVar257 = ZEXT1664(auVar73);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(auVar75,auVar24);
              if (auVar74._0_4_ < auVar78._0_4_) {
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar228._0_4_)),local_6d0,
                                          ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(ZEXT416((uint)fVar255),auVar25);
                if (auVar75._0_4_ < auVar74._0_4_) {
                  bVar68 = uVar61 < 5;
                  fVar248 = auVar73._0_4_ + (float)local_6e0._0_4_;
                  if ((fVar143 <= fVar248) &&
                     (fVar253 = *(float *)(ray + k * 4 + 0x100), fVar248 <= fVar253)) {
                    auVar74 = vmovshdup_avx(auVar73);
                    bVar62 = 0;
                    if ((auVar74._0_4_ < 0.0) || (1.0 < auVar74._0_4_)) goto LAB_019de0b5;
                    auVar221._0_12_ = ZEXT812(0);
                    auVar221._12_4_ = 0;
                    auVar200._4_8_ = auVar221._4_8_;
                    auVar200._0_4_ = local_7e0._0_4_;
                    auVar200._12_4_ = 0;
                    auVar74 = vrsqrt14ss_avx512f(auVar221,auVar200);
                    fVar254 = auVar74._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar62 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_019de0b5;
                      fVar254 = fVar254 * 1.5 + local_7e0._0_4_ * -0.5 * fVar254 * fVar254 * fVar254
                      ;
                      auVar201._0_4_ = auVar71._0_4_ * fVar254;
                      auVar201._4_4_ = auVar71._4_4_ * fVar254;
                      auVar201._8_4_ = auVar71._8_4_ * fVar254;
                      auVar201._12_4_ = auVar71._12_4_ * fVar254;
                      auVar228 = vfmadd213ps_fma(auVar76,auVar201,auVar1);
                      auVar74 = vshufps_avx(auVar201,auVar201,0xc9);
                      auVar75 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar202._0_4_ = auVar201._0_4_ * auVar75._0_4_;
                      auVar202._4_4_ = auVar201._4_4_ * auVar75._4_4_;
                      auVar202._8_4_ = auVar201._8_4_ * auVar75._8_4_;
                      auVar202._12_4_ = auVar201._12_4_ * auVar75._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar202,auVar1,auVar74);
                      auVar74 = vshufps_avx(auVar72,auVar72,0xc9);
                      auVar75 = vshufps_avx(auVar228,auVar228,0xc9);
                      auVar72 = vshufps_avx(auVar72,auVar72,0xd2);
                      auVar152._0_4_ = auVar228._0_4_ * auVar72._0_4_;
                      auVar152._4_4_ = auVar228._4_4_ * auVar72._4_4_;
                      auVar152._8_4_ = auVar228._8_4_ * auVar72._8_4_;
                      auVar152._12_4_ = auVar228._12_4_ * auVar72._12_4_;
                      auVar74 = vfmsub231ps_fma(auVar152,auVar74,auVar75);
                      auVar223._8_4_ = 1;
                      auVar223._0_8_ = 0x100000001;
                      auVar223._12_4_ = 1;
                      auVar223._16_4_ = 1;
                      auVar223._20_4_ = 1;
                      auVar223._24_4_ = 1;
                      auVar223._28_4_ = 1;
                      local_420 = vpermps_avx2(auVar223,ZEXT1632(auVar73));
                      auVar83 = vpermps_avx2(auVar223,ZEXT1632(auVar74));
                      auVar235._8_4_ = 2;
                      auVar235._0_8_ = 0x200000002;
                      auVar235._12_4_ = 2;
                      auVar235._16_4_ = 2;
                      auVar235._20_4_ = 2;
                      auVar235._24_4_ = 2;
                      auVar235._28_4_ = 2;
                      local_460 = vpermps_avx2(auVar235,ZEXT1632(auVar74));
                      local_440 = auVar74._0_4_;
                      local_480[0] = (RTCHitN)auVar83[0];
                      local_480[1] = (RTCHitN)auVar83[1];
                      local_480[2] = (RTCHitN)auVar83[2];
                      local_480[3] = (RTCHitN)auVar83[3];
                      local_480[4] = (RTCHitN)auVar83[4];
                      local_480[5] = (RTCHitN)auVar83[5];
                      local_480[6] = (RTCHitN)auVar83[6];
                      local_480[7] = (RTCHitN)auVar83[7];
                      local_480[8] = (RTCHitN)auVar83[8];
                      local_480[9] = (RTCHitN)auVar83[9];
                      local_480[10] = (RTCHitN)auVar83[10];
                      local_480[0xb] = (RTCHitN)auVar83[0xb];
                      local_480[0xc] = (RTCHitN)auVar83[0xc];
                      local_480[0xd] = (RTCHitN)auVar83[0xd];
                      local_480[0xe] = (RTCHitN)auVar83[0xe];
                      local_480[0xf] = (RTCHitN)auVar83[0xf];
                      local_480[0x10] = (RTCHitN)auVar83[0x10];
                      local_480[0x11] = (RTCHitN)auVar83[0x11];
                      local_480[0x12] = (RTCHitN)auVar83[0x12];
                      local_480[0x13] = (RTCHitN)auVar83[0x13];
                      local_480[0x14] = (RTCHitN)auVar83[0x14];
                      local_480[0x15] = (RTCHitN)auVar83[0x15];
                      local_480[0x16] = (RTCHitN)auVar83[0x16];
                      local_480[0x17] = (RTCHitN)auVar83[0x17];
                      local_480[0x18] = (RTCHitN)auVar83[0x18];
                      local_480[0x19] = (RTCHitN)auVar83[0x19];
                      local_480[0x1a] = (RTCHitN)auVar83[0x1a];
                      local_480[0x1b] = (RTCHitN)auVar83[0x1b];
                      local_480[0x1c] = (RTCHitN)auVar83[0x1c];
                      local_480[0x1d] = (RTCHitN)auVar83[0x1d];
                      local_480[0x1e] = (RTCHitN)auVar83[0x1e];
                      local_480[0x1f] = (RTCHitN)auVar83[0x1f];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_400 = ZEXT432(0) << 0x20;
                      local_3e0 = local_4a0._0_8_;
                      uStack_3d8 = local_4a0._8_8_;
                      uStack_3d0 = local_4a0._16_8_;
                      uStack_3c8 = local_4a0._24_8_;
                      local_3c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_3a0 = context->user->instID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_380 = context->user->instPrimID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      *(float *)(ray + k * 4 + 0x100) = fVar248;
                      local_700 = local_500;
                      local_810.valid = (int *)local_700;
                      local_810.geometryUserPtr = pGVar3->userPtr;
                      local_810.context = context->user;
                      local_810.hit = local_480;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar247 = ZEXT1664(auVar245);
                        auVar252 = ZEXT1664(auVar250);
                        auVar257 = ZEXT1664(auVar73);
                        auVar259 = ZEXT1664(auVar71);
                        auVar261 = ZEXT1664(local_7e0._0_16_);
                        auVar265 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_810);
                      }
                      if (local_700 != (undefined1  [32])0x0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar247 = ZEXT1664(auVar247._0_16_);
                          auVar252 = ZEXT1664(auVar252._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar261 = ZEXT1664(auVar261._0_16_);
                          auVar265 = ZEXT1664(auVar265._0_16_);
                          (*p_Var4)(&local_810);
                        }
                        uVar69 = vptestmd_avx512vl(local_700,local_700);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar69 & 1);
                        bVar6 = (bool)((byte)(uVar69 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar69 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar69 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar69 >> 6) & 1);
                        bVar12 = SUB81(uVar69 >> 7,0);
                        *(uint *)(local_810.ray + 0x100) =
                             (uint)bVar5 * auVar83._0_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x100);
                        *(uint *)(local_810.ray + 0x104) =
                             (uint)bVar6 * auVar83._4_4_ |
                             (uint)!bVar6 * *(int *)(local_810.ray + 0x104);
                        *(uint *)(local_810.ray + 0x108) =
                             (uint)bVar7 * auVar83._8_4_ |
                             (uint)!bVar7 * *(int *)(local_810.ray + 0x108);
                        *(uint *)(local_810.ray + 0x10c) =
                             (uint)bVar8 * auVar83._12_4_ |
                             (uint)!bVar8 * *(int *)(local_810.ray + 0x10c);
                        *(uint *)(local_810.ray + 0x110) =
                             (uint)bVar9 * auVar83._16_4_ |
                             (uint)!bVar9 * *(int *)(local_810.ray + 0x110);
                        *(uint *)(local_810.ray + 0x114) =
                             (uint)bVar10 * auVar83._20_4_ |
                             (uint)!bVar10 * *(int *)(local_810.ray + 0x114);
                        *(uint *)(local_810.ray + 0x118) =
                             (uint)bVar11 * auVar83._24_4_ |
                             (uint)!bVar11 * *(int *)(local_810.ray + 0x118);
                        *(uint *)(local_810.ray + 0x11c) =
                             (uint)bVar12 * auVar83._28_4_ |
                             (uint)!bVar12 * *(int *)(local_810.ray + 0x11c);
                        bVar62 = 1;
                        if (local_700 != (undefined1  [32])0x0) goto LAB_019de0b5;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar253;
                    }
                  }
                  bVar62 = 0;
                  goto LAB_019de0b5;
                }
              }
              uVar61 = uVar61 + 1;
            }
            bVar68 = false;
LAB_019de0b5:
            bVar67 = bVar67 | bVar68 & bVar62;
            uVar167 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar240._4_4_ = uVar167;
            auVar240._0_4_ = uVar167;
            auVar240._8_4_ = uVar167;
            auVar240._12_4_ = uVar167;
            auVar240._16_4_ = uVar167;
            auVar240._20_4_ = uVar167;
            auVar240._24_4_ = uVar167;
            auVar240._28_4_ = uVar167;
            auVar241 = ZEXT3264(auVar240);
            auVar53._4_4_ = fStack_53c;
            auVar53._0_4_ = local_540;
            auVar53._8_4_ = fStack_538;
            auVar53._12_4_ = fStack_534;
            auVar53._16_4_ = fStack_530;
            auVar53._20_4_ = fStack_52c;
            auVar53._24_4_ = fStack_528;
            auVar53._28_4_ = fStack_524;
            uVar16 = vcmpps_avx512vl(auVar240,auVar53,0xd);
          }
          uVar18 = vpcmpd_avx512vl(local_4e0,local_320,1);
          uVar17 = vpcmpd_avx512vl(local_4e0,_local_560,1);
          auVar180._0_4_ = (float)local_580._0_4_ + (float)local_1c0._0_4_;
          auVar180._4_4_ = (float)local_580._4_4_ + (float)local_1c0._4_4_;
          auVar180._8_4_ = fStack_578 + fStack_1b8;
          auVar180._12_4_ = fStack_574 + fStack_1b4;
          auVar180._16_4_ = fStack_570 + fStack_1b0;
          auVar180._20_4_ = fStack_56c + fStack_1ac;
          auVar180._24_4_ = fStack_568 + fStack_1a8;
          auVar180._28_4_ = fStack_564 + fStack_1a4;
          uVar167 = auVar241._0_4_;
          auVar204._4_4_ = uVar167;
          auVar204._0_4_ = uVar167;
          auVar204._8_4_ = uVar167;
          auVar204._12_4_ = uVar167;
          auVar204._16_4_ = uVar167;
          auVar204._20_4_ = uVar167;
          auVar204._24_4_ = uVar167;
          auVar204._28_4_ = uVar167;
          uVar16 = vcmpps_avx512vl(auVar180,auVar204,2);
          bVar60 = bVar60 & (byte)uVar18 & (byte)uVar16;
          auVar224._0_4_ = (float)local_580._0_4_ + (float)local_360._0_4_;
          auVar224._4_4_ = (float)local_580._4_4_ + (float)local_360._4_4_;
          auVar224._8_4_ = fStack_578 + fStack_358;
          auVar224._12_4_ = fStack_574 + fStack_354;
          auVar224._16_4_ = fStack_570 + fStack_350;
          auVar224._20_4_ = fStack_56c + fStack_34c;
          auVar224._24_4_ = fStack_568 + fStack_348;
          auVar224._28_4_ = fStack_564 + fStack_344;
          uVar16 = vcmpps_avx512vl(auVar224,auVar204,2);
          bVar55 = bVar55 & (byte)uVar17 & (byte)uVar16 | bVar60;
          if (bVar55 != 0) {
            abStack_180[uVar59 * 0x60] = bVar55;
            bVar68 = (bool)(bVar60 >> 1 & 1);
            bVar5 = (bool)(bVar60 >> 2 & 1);
            bVar6 = (bool)(bVar60 >> 3 & 1);
            bVar7 = (bool)(bVar60 >> 4 & 1);
            bVar8 = (bool)(bVar60 >> 5 & 1);
            auStack_160[uVar59 * 0x18] =
                 (uint)(bVar60 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar60 & 1) * local_360._0_4_;
            auStack_160[uVar59 * 0x18 + 1] =
                 (uint)bVar68 * local_1c0._4_4_ | (uint)!bVar68 * local_360._4_4_;
            auStack_160[uVar59 * 0x18 + 2] =
                 (uint)bVar5 * (int)fStack_1b8 | (uint)!bVar5 * (int)fStack_358;
            auStack_160[uVar59 * 0x18 + 3] =
                 (uint)bVar6 * (int)fStack_1b4 | (uint)!bVar6 * (int)fStack_354;
            auStack_160[uVar59 * 0x18 + 4] =
                 (uint)bVar7 * (int)fStack_1b0 | (uint)!bVar7 * (int)fStack_350;
            auStack_160[uVar59 * 0x18 + 5] =
                 (uint)bVar8 * (int)fStack_1ac | (uint)!bVar8 * (int)fStack_34c;
            auStack_160[uVar59 * 0x18 + 6] =
                 (uint)(bVar60 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar60 >> 6) * (int)fStack_348;
            (&fStack_144)[uVar59 * 0x18] = fStack_344;
            uVar69 = vmovlps_avx(local_510);
            (&uStack_140)[uVar59 * 0xc] = uVar69;
            aiStack_138[uVar59 * 0x18] = iVar66 + 1;
            uVar59 = (ulong)((int)uVar59 + 1);
          }
          auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar269 = ZEXT3264(auVar82);
          auVar241 = ZEXT3264(_DAT_01f7b040);
        }
      }
    }
    do {
      uVar70 = (uint)uVar59;
      uVar59 = (ulong)(uVar70 - 1);
      if (uVar70 == 0) {
        if (bVar67 != 0) goto LAB_019de6e7;
        uVar167 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar31._4_4_ = uVar167;
        auVar31._0_4_ = uVar167;
        auVar31._8_4_ = uVar167;
        auVar31._12_4_ = uVar167;
        auVar31._16_4_ = uVar167;
        auVar31._20_4_ = uVar167;
        auVar31._24_4_ = uVar167;
        auVar31._28_4_ = uVar167;
        uVar16 = vcmpps_avx512vl(local_300,auVar31,2);
        uVar64 = (ulong)((uint)uVar63 & (uint)uVar16);
        goto LAB_019dbca9;
      }
      auVar82 = *(undefined1 (*) [32])(auStack_160 + uVar59 * 0x18);
      auVar181._0_4_ = auVar82._0_4_ + (float)local_580._0_4_;
      auVar181._4_4_ = auVar82._4_4_ + (float)local_580._4_4_;
      auVar181._8_4_ = auVar82._8_4_ + fStack_578;
      auVar181._12_4_ = auVar82._12_4_ + fStack_574;
      auVar181._16_4_ = auVar82._16_4_ + fStack_570;
      auVar181._20_4_ = auVar82._20_4_ + fStack_56c;
      auVar181._24_4_ = auVar82._24_4_ + fStack_568;
      auVar181._28_4_ = auVar82._28_4_ + fStack_564;
      uVar167 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30._4_4_ = uVar167;
      auVar30._0_4_ = uVar167;
      auVar30._8_4_ = uVar167;
      auVar30._12_4_ = uVar167;
      auVar30._16_4_ = uVar167;
      auVar30._20_4_ = uVar167;
      auVar30._24_4_ = uVar167;
      auVar30._28_4_ = uVar167;
      uVar16 = vcmpps_avx512vl(auVar181,auVar30,2);
      uVar136 = (uint)uVar16 & (uint)abStack_180[uVar59 * 0x60];
    } while (uVar136 == 0);
    uVar69 = (&uStack_140)[uVar59 * 0xc];
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar69;
    auVar205._8_4_ = 0x7f800000;
    auVar205._0_8_ = 0x7f8000007f800000;
    auVar205._12_4_ = 0x7f800000;
    auVar205._16_4_ = 0x7f800000;
    auVar205._20_4_ = 0x7f800000;
    auVar205._24_4_ = 0x7f800000;
    auVar205._28_4_ = 0x7f800000;
    auVar83 = vblendmps_avx512vl(auVar205,auVar82);
    bVar55 = (byte)uVar136;
    auVar135._0_4_ =
         (uint)(bVar55 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)auVar82._0_4_;
    bVar68 = (bool)((byte)(uVar136 >> 1) & 1);
    auVar135._4_4_ = (uint)bVar68 * auVar83._4_4_ | (uint)!bVar68 * (int)auVar82._4_4_;
    bVar68 = (bool)((byte)(uVar136 >> 2) & 1);
    auVar135._8_4_ = (uint)bVar68 * auVar83._8_4_ | (uint)!bVar68 * (int)auVar82._8_4_;
    bVar68 = (bool)((byte)(uVar136 >> 3) & 1);
    auVar135._12_4_ = (uint)bVar68 * auVar83._12_4_ | (uint)!bVar68 * (int)auVar82._12_4_;
    bVar68 = (bool)((byte)(uVar136 >> 4) & 1);
    auVar135._16_4_ = (uint)bVar68 * auVar83._16_4_ | (uint)!bVar68 * (int)auVar82._16_4_;
    bVar68 = (bool)((byte)(uVar136 >> 5) & 1);
    auVar135._20_4_ = (uint)bVar68 * auVar83._20_4_ | (uint)!bVar68 * (int)auVar82._20_4_;
    bVar68 = (bool)((byte)(uVar136 >> 6) & 1);
    auVar135._24_4_ = (uint)bVar68 * auVar83._24_4_ | (uint)!bVar68 * (int)auVar82._24_4_;
    auVar135._28_4_ =
         (uVar136 >> 7) * auVar83._28_4_ | (uint)!SUB41(uVar136 >> 7,0) * (int)auVar82._28_4_;
    auVar82 = vshufps_avx(auVar135,auVar135,0xb1);
    auVar82 = vminps_avx(auVar135,auVar82);
    auVar83 = vshufpd_avx(auVar82,auVar82,5);
    auVar82 = vminps_avx(auVar82,auVar83);
    auVar83 = vpermpd_avx2(auVar82,0x4e);
    auVar82 = vminps_avx(auVar82,auVar83);
    uVar16 = vcmpps_avx512vl(auVar135,auVar82,0);
    bVar65 = (byte)uVar16 & bVar55;
    if (bVar65 != 0) {
      uVar136 = (uint)bVar65;
    }
    uVar137 = 0;
    for (; (uVar136 & 1) == 0; uVar136 = uVar136 >> 1 | 0x80000000) {
      uVar137 = uVar137 + 1;
    }
    iVar66 = aiStack_138[uVar59 * 0x18];
    bVar55 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar55;
    abStack_180[uVar59 * 0x60] = bVar55;
    if (bVar55 == 0) {
      uVar70 = uVar70 - 1;
    }
    uVar167 = (undefined4)uVar69;
    auVar160._4_4_ = uVar167;
    auVar160._0_4_ = uVar167;
    auVar160._8_4_ = uVar167;
    auVar160._12_4_ = uVar167;
    auVar160._16_4_ = uVar167;
    auVar160._20_4_ = uVar167;
    auVar160._24_4_ = uVar167;
    auVar160._28_4_ = uVar167;
    auVar73 = vmovshdup_avx(auVar178);
    auVar73 = vsubps_avx(auVar73,auVar178);
    auVar182._0_4_ = auVar73._0_4_;
    auVar182._4_4_ = auVar182._0_4_;
    auVar182._8_4_ = auVar182._0_4_;
    auVar182._12_4_ = auVar182._0_4_;
    auVar182._16_4_ = auVar182._0_4_;
    auVar182._20_4_ = auVar182._0_4_;
    auVar182._24_4_ = auVar182._0_4_;
    auVar182._28_4_ = auVar182._0_4_;
    auVar73 = vfmadd132ps_fma(auVar182,auVar160,auVar241._0_32_);
    auVar82 = ZEXT1632(auVar73);
    local_480[0] = (RTCHitN)auVar82[0];
    local_480[1] = (RTCHitN)auVar82[1];
    local_480[2] = (RTCHitN)auVar82[2];
    local_480[3] = (RTCHitN)auVar82[3];
    local_480[4] = (RTCHitN)auVar82[4];
    local_480[5] = (RTCHitN)auVar82[5];
    local_480[6] = (RTCHitN)auVar82[6];
    local_480[7] = (RTCHitN)auVar82[7];
    local_480[8] = (RTCHitN)auVar82[8];
    local_480[9] = (RTCHitN)auVar82[9];
    local_480[10] = (RTCHitN)auVar82[10];
    local_480[0xb] = (RTCHitN)auVar82[0xb];
    local_480[0xc] = (RTCHitN)auVar82[0xc];
    local_480[0xd] = (RTCHitN)auVar82[0xd];
    local_480[0xe] = (RTCHitN)auVar82[0xe];
    local_480[0xf] = (RTCHitN)auVar82[0xf];
    local_480[0x10] = (RTCHitN)auVar82[0x10];
    local_480[0x11] = (RTCHitN)auVar82[0x11];
    local_480[0x12] = (RTCHitN)auVar82[0x12];
    local_480[0x13] = (RTCHitN)auVar82[0x13];
    local_480[0x14] = (RTCHitN)auVar82[0x14];
    local_480[0x15] = (RTCHitN)auVar82[0x15];
    local_480[0x16] = (RTCHitN)auVar82[0x16];
    local_480[0x17] = (RTCHitN)auVar82[0x17];
    local_480[0x18] = (RTCHitN)auVar82[0x18];
    local_480[0x19] = (RTCHitN)auVar82[0x19];
    local_480[0x1a] = (RTCHitN)auVar82[0x1a];
    local_480[0x1b] = (RTCHitN)auVar82[0x1b];
    local_480[0x1c] = (RTCHitN)auVar82[0x1c];
    local_480[0x1d] = (RTCHitN)auVar82[0x1d];
    local_480[0x1e] = (RTCHitN)auVar82[0x1e];
    local_480[0x1f] = (RTCHitN)auVar82[0x1f];
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_480 + (ulong)uVar137 * 4);
    uVar59 = (ulong)uVar70;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }